

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  undefined1 auVar23 [16];
  RTCFeatureFlags RVar24;
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  int iVar52;
  ulong uVar53;
  RTCFilterFunctionN p_Var54;
  RayHitK<4> *pRVar55;
  RTCIntersectArguments *pRVar56;
  int iVar57;
  undefined4 uVar58;
  RTCIntersectArguments *pRVar59;
  ulong uVar60;
  RTCIntersectArguments *pRVar61;
  Geometry *pGVar62;
  long lVar63;
  long lVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  short sVar74;
  undefined2 uVar112;
  float fVar75;
  float fVar76;
  float fVar113;
  float fVar115;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar114;
  float fVar116;
  undefined8 uVar117;
  float fVar118;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar119;
  float fVar120;
  float fVar152;
  float fVar154;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar157;
  float fVar168;
  float fVar170;
  vfloat4 v;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar158;
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar173;
  float fVar191;
  float fVar192;
  vfloat4 v_1;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar196;
  float fVar205;
  float fVar206;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar208;
  float fVar230;
  float fVar233;
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar244;
  float fVar247;
  undefined1 auVar241 [16];
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar252;
  float fVar253;
  float fVar260;
  float fVar262;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [16];
  float fVar261;
  float fVar263;
  float fVar264;
  undefined1 auVar259 [16];
  float fVar265;
  float fVar267;
  float fVar268;
  undefined1 auVar266 [16];
  float fVar269;
  float fVar276;
  float fVar277;
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar278;
  float fVar279;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar280 [16];
  undefined1 auVar283 [16];
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar301;
  float fVar302;
  float fVar311;
  float fVar313;
  float fVar314;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar312;
  undefined1 auVar310 [16];
  float fVar315;
  float fVar316;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_4> bhit;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_438;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  Precalculations *local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  RTCFilterFunctionNArguments local_388;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 (*local_2c0) [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  LinearSpace3fa *local_228;
  Primitive *local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  uint local_1e8;
  int local_1e4;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  float local_188 [4];
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168 [4];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [12];
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 uVar111;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  
  PVar18 = prim[1];
  uVar53 = (ulong)(byte)PVar18;
  lVar22 = uVar53 * 0x25;
  pPVar8 = prim + lVar22 + 6;
  fVar170 = *(float *)(pPVar8 + 0xc);
  fVar173 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar170;
  fVar191 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar170;
  fVar192 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar170;
  fVar157 = *(float *)(ray + k * 4 + 0x40) * fVar170;
  fVar168 = *(float *)(ray + k * 4 + 0x50) * fVar170;
  fVar170 = *(float *)(ray + k * 4 + 0x60) * fVar170;
  uVar58 = *(undefined4 *)(prim + uVar53 * 4 + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar65;
  auVar77._12_2_ = uVar112;
  auVar77._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar160._12_4_ = auVar77._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar65;
  auVar160._10_2_ = uVar112;
  auVar274._10_6_ = auVar160._10_6_;
  auVar274._8_2_ = uVar112;
  auVar274._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar26._4_8_ = auVar274._8_8_;
  auVar26._2_2_ = uVar112;
  auVar26._0_2_ = uVar112;
  fVar315 = (float)((int)sVar74 >> 8);
  fVar321 = (float)(auVar26._0_4_ >> 0x18);
  fVar322 = (float)(auVar274._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 5 + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar65;
  auVar123._12_2_ = uVar112;
  auVar123._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar65;
  auVar122._10_2_ = uVar112;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar112;
  auVar121._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar27._4_8_ = auVar121._8_8_;
  auVar27._2_2_ = uVar112;
  auVar27._0_2_ = uVar112;
  fVar196 = (float)((int)sVar74 >> 8);
  fVar205 = (float)(auVar27._0_4_ >> 0x18);
  fVar206 = (float)(auVar121._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 6 + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar65;
  auVar126._12_2_ = uVar112;
  auVar126._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar65;
  auVar125._10_2_ = uVar112;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar112;
  auVar124._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar28._4_8_ = auVar124._8_8_;
  auVar28._2_2_ = uVar112;
  auVar28._0_2_ = uVar112;
  fVar238 = (float)((int)sVar74 >> 8);
  fVar244 = (float)(auVar28._0_4_ >> 0x18);
  fVar247 = (float)(auVar124._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 0xf + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar65;
  auVar129._12_2_ = uVar112;
  auVar129._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar65;
  auVar128._10_2_ = uVar112;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar112;
  auVar127._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar29._4_8_ = auVar127._8_8_;
  auVar29._2_2_ = uVar112;
  auVar29._0_2_ = uVar112;
  fVar75 = (float)((int)sVar74 >> 8);
  fVar113 = (float)(auVar29._0_4_ >> 0x18);
  fVar115 = (float)(auVar127._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar65;
  auVar211._12_2_ = uVar112;
  auVar211._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar65;
  auVar210._10_2_ = uVar112;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar112;
  auVar209._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar30._4_8_ = auVar209._8_8_;
  auVar30._2_2_ = uVar112;
  auVar30._0_2_ = uVar112;
  fVar252 = (float)((int)sVar74 >> 8);
  fVar260 = (float)(auVar30._0_4_ >> 0x18);
  fVar262 = (float)(auVar209._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar53 + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar65;
  auVar214._12_2_ = uVar112;
  auVar214._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar65;
  auVar213._10_2_ = uVar112;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar112;
  auVar212._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar31._4_8_ = auVar212._8_8_;
  auVar31._2_2_ = uVar112;
  auVar31._0_2_ = uVar112;
  fVar269 = (float)((int)sVar74 >> 8);
  fVar276 = (float)(auVar31._0_4_ >> 0x18);
  fVar277 = (float)(auVar212._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 0x1a + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar65;
  auVar217._12_2_ = uVar112;
  auVar217._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar65;
  auVar216._10_2_ = uVar112;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar112;
  auVar215._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar32._4_8_ = auVar215._8_8_;
  auVar32._2_2_ = uVar112;
  auVar32._0_2_ = uVar112;
  fVar265 = (float)((int)sVar74 >> 8);
  fVar267 = (float)(auVar32._0_4_ >> 0x18);
  fVar268 = (float)(auVar215._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 0x1b + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar65;
  auVar220._12_2_ = uVar112;
  auVar220._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar65;
  auVar219._10_2_ = uVar112;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar112;
  auVar218._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar33._4_8_ = auVar218._8_8_;
  auVar33._2_2_ = uVar112;
  auVar33._0_2_ = uVar112;
  fVar278 = (float)((int)sVar74 >> 8);
  fVar284 = (float)(auVar33._0_4_ >> 0x18);
  fVar286 = (float)(auVar218._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar53 * 0x1c + 6);
  uVar111 = (undefined1)((uint)uVar58 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar58 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar58));
  uVar111 = (undefined1)((uint)uVar58 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar74 = CONCAT11((char)uVar58,(char)uVar58);
  uVar65 = CONCAT62(uVar25,sVar74);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar65;
  auVar223._12_2_ = uVar112;
  auVar223._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar65;
  auVar222._10_2_ = uVar112;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar112;
  auVar221._0_8_ = uVar65;
  uVar112 = (undefined2)uVar25;
  auVar34._4_8_ = auVar221._8_8_;
  auVar34._2_2_ = uVar112;
  auVar34._0_2_ = uVar112;
  fVar119 = (float)((int)sVar74 >> 8);
  fVar152 = (float)(auVar34._0_4_ >> 0x18);
  fVar154 = (float)(auVar221._8_4_ >> 0x18);
  fVar301 = fVar157 * fVar315 + fVar168 * fVar196 + fVar170 * fVar238;
  fVar311 = fVar157 * fVar321 + fVar168 * fVar205 + fVar170 * fVar244;
  fVar313 = fVar157 * fVar322 + fVar168 * fVar206 + fVar170 * fVar247;
  fVar314 = fVar157 * (float)(auVar160._12_4_ >> 0x18) +
            fVar168 * (float)(auVar122._12_4_ >> 0x18) + fVar170 * (float)(auVar125._12_4_ >> 0x18);
  fVar291 = fVar157 * fVar75 + fVar168 * fVar252 + fVar170 * fVar269;
  fVar298 = fVar157 * fVar113 + fVar168 * fVar260 + fVar170 * fVar276;
  fVar299 = fVar157 * fVar115 + fVar168 * fVar262 + fVar170 * fVar277;
  fVar300 = fVar157 * (float)(auVar128._12_4_ >> 0x18) +
            fVar168 * (float)(auVar210._12_4_ >> 0x18) + fVar170 * (float)(auVar213._12_4_ >> 0x18);
  fVar207 = fVar157 * fVar265 + fVar168 * fVar278 + fVar170 * fVar119;
  fVar230 = fVar157 * fVar267 + fVar168 * fVar284 + fVar170 * fVar152;
  fVar233 = fVar157 * fVar268 + fVar168 * fVar286 + fVar170 * fVar154;
  fVar157 = fVar157 * (float)(auVar216._12_4_ >> 0x18) +
            fVar168 * (float)(auVar219._12_4_ >> 0x18) + fVar170 * (float)(auVar222._12_4_ >> 0x18);
  fVar316 = fVar315 * fVar173 + fVar196 * fVar191 + fVar238 * fVar192;
  fVar321 = fVar321 * fVar173 + fVar205 * fVar191 + fVar244 * fVar192;
  fVar322 = fVar322 * fVar173 + fVar206 * fVar191 + fVar247 * fVar192;
  fVar323 = (float)(auVar160._12_4_ >> 0x18) * fVar173 +
            (float)(auVar122._12_4_ >> 0x18) * fVar191 + (float)(auVar125._12_4_ >> 0x18) * fVar192;
  fVar269 = fVar75 * fVar173 + fVar252 * fVar191 + fVar269 * fVar192;
  fVar276 = fVar113 * fVar173 + fVar260 * fVar191 + fVar276 * fVar192;
  fVar277 = fVar115 * fVar173 + fVar262 * fVar191 + fVar277 * fVar192;
  fVar315 = (float)(auVar128._12_4_ >> 0x18) * fVar173 +
            (float)(auVar210._12_4_ >> 0x18) * fVar191 + (float)(auVar213._12_4_ >> 0x18) * fVar192;
  fVar265 = fVar173 * fVar265 + fVar191 * fVar278 + fVar192 * fVar119;
  fVar267 = fVar173 * fVar267 + fVar191 * fVar284 + fVar192 * fVar152;
  fVar268 = fVar173 * fVar268 + fVar191 * fVar286 + fVar192 * fVar154;
  fVar278 = fVar173 * (float)(auVar216._12_4_ >> 0x18) +
            fVar191 * (float)(auVar219._12_4_ >> 0x18) + fVar192 * (float)(auVar222._12_4_ >> 0x18);
  fVar170 = (float)DAT_01ff1d40;
  fVar75 = DAT_01ff1d40._4_4_;
  fVar113 = DAT_01ff1d40._8_4_;
  fVar115 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar170 <= ABS(fVar301));
  uVar67 = -(uint)(fVar75 <= ABS(fVar311));
  uVar69 = -(uint)(fVar113 <= ABS(fVar313));
  uVar71 = -(uint)(fVar115 <= ABS(fVar314));
  auVar303._0_4_ = (uint)fVar301 & uVar66;
  auVar303._4_4_ = (uint)fVar311 & uVar67;
  auVar303._8_4_ = (uint)fVar313 & uVar69;
  auVar303._12_4_ = (uint)fVar314 & uVar71;
  auVar174._0_4_ = ~uVar66 & (uint)fVar170;
  auVar174._4_4_ = ~uVar67 & (uint)fVar75;
  auVar174._8_4_ = ~uVar69 & (uint)fVar113;
  auVar174._12_4_ = ~uVar71 & (uint)fVar115;
  auVar174 = auVar174 | auVar303;
  uVar66 = -(uint)(fVar170 <= ABS(fVar291));
  uVar67 = -(uint)(fVar75 <= ABS(fVar298));
  uVar69 = -(uint)(fVar113 <= ABS(fVar299));
  uVar71 = -(uint)(fVar115 <= ABS(fVar300));
  auVar292._0_4_ = (uint)fVar291 & uVar66;
  auVar292._4_4_ = (uint)fVar298 & uVar67;
  auVar292._8_4_ = (uint)fVar299 & uVar69;
  auVar292._12_4_ = (uint)fVar300 & uVar71;
  auVar241._0_4_ = ~uVar66 & (uint)fVar170;
  auVar241._4_4_ = ~uVar67 & (uint)fVar75;
  auVar241._8_4_ = ~uVar69 & (uint)fVar113;
  auVar241._12_4_ = ~uVar71 & (uint)fVar115;
  auVar241 = auVar241 | auVar292;
  uVar66 = -(uint)(fVar170 <= ABS(fVar207));
  uVar67 = -(uint)(fVar75 <= ABS(fVar230));
  uVar69 = -(uint)(fVar113 <= ABS(fVar233));
  uVar71 = -(uint)(fVar115 <= ABS(fVar157));
  auVar224._0_4_ = (uint)fVar207 & uVar66;
  auVar224._4_4_ = (uint)fVar230 & uVar67;
  auVar224._8_4_ = (uint)fVar233 & uVar69;
  auVar224._12_4_ = (uint)fVar157 & uVar71;
  auVar254._0_4_ = ~uVar66 & (uint)fVar170;
  auVar254._4_4_ = ~uVar67 & (uint)fVar75;
  auVar254._8_4_ = ~uVar69 & (uint)fVar113;
  auVar254._12_4_ = ~uVar71 & (uint)fVar115;
  auVar254 = auVar254 | auVar224;
  auVar77 = rcpps(_DAT_01ff1d40,auVar174);
  fVar170 = auVar77._0_4_;
  fVar115 = auVar77._4_4_;
  fVar196 = auVar77._8_4_;
  fVar252 = auVar77._12_4_;
  fVar170 = (1.0 - auVar174._0_4_ * fVar170) * fVar170 + fVar170;
  fVar115 = (1.0 - auVar174._4_4_ * fVar115) * fVar115 + fVar115;
  fVar196 = (1.0 - auVar174._8_4_ * fVar196) * fVar196 + fVar196;
  fVar252 = (1.0 - auVar174._12_4_ * fVar252) * fVar252 + fVar252;
  auVar77 = rcpps(auVar77,auVar241);
  fVar75 = auVar77._0_4_;
  fVar119 = auVar77._4_4_;
  fVar205 = auVar77._8_4_;
  fVar260 = auVar77._12_4_;
  fVar75 = (1.0 - auVar241._0_4_ * fVar75) * fVar75 + fVar75;
  fVar119 = (1.0 - auVar241._4_4_ * fVar119) * fVar119 + fVar119;
  fVar205 = (1.0 - auVar241._8_4_ * fVar205) * fVar205 + fVar205;
  fVar260 = (1.0 - auVar241._12_4_ * fVar260) * fVar260 + fVar260;
  auVar77 = rcpps(auVar77,auVar254);
  fVar113 = auVar77._0_4_;
  fVar152 = auVar77._4_4_;
  fVar206 = auVar77._8_4_;
  fVar262 = auVar77._12_4_;
  fVar113 = (1.0 - auVar254._0_4_ * fVar113) * fVar113 + fVar113;
  fVar152 = (1.0 - auVar254._4_4_ * fVar152) * fVar152 + fVar152;
  fVar206 = (1.0 - auVar254._8_4_ * fVar206) * fVar206 + fVar206;
  fVar262 = (1.0 - auVar254._12_4_ * fVar262) * fVar262 + fVar262;
  fVar284 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar65 = *(ulong *)(prim + uVar53 * 7 + 6);
  uVar112 = (undefined2)(uVar65 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar65;
  auVar80._12_2_ = uVar112;
  auVar80._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar65 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar65;
  auVar79._10_2_ = uVar112;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar112;
  auVar78._0_8_ = uVar65;
  uVar112 = (undefined2)(uVar65 >> 0x10);
  auVar35._4_8_ = auVar78._8_8_;
  auVar35._2_2_ = uVar112;
  auVar35._0_2_ = uVar112;
  fVar154 = (float)(auVar35._0_4_ >> 0x10);
  fVar207 = (float)(auVar78._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar53 * 0xb + 6);
  uVar112 = (undefined2)(uVar9 >> 0x30);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar9;
  auVar177._12_2_ = uVar112;
  auVar177._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar9 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar9;
  auVar176._10_2_ = uVar112;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar112;
  auVar175._0_8_ = uVar9;
  uVar112 = (undefined2)(uVar9 >> 0x10);
  auVar36._4_8_ = auVar175._8_8_;
  auVar36._2_2_ = uVar112;
  auVar36._0_2_ = uVar112;
  uVar10 = *(ulong *)(prim + uVar53 * 9 + 6);
  uVar112 = (undefined2)(uVar10 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar10;
  auVar83._12_2_ = uVar112;
  auVar83._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar10 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar10;
  auVar82._10_2_ = uVar112;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar112;
  auVar81._0_8_ = uVar10;
  uVar112 = (undefined2)(uVar10 >> 0x10);
  auVar37._4_8_ = auVar81._8_8_;
  auVar37._2_2_ = uVar112;
  auVar37._0_2_ = uVar112;
  fVar157 = (float)(auVar37._0_4_ >> 0x10);
  fVar230 = (float)(auVar81._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar53 * 0xd + 6);
  uVar112 = (undefined2)(uVar11 >> 0x30);
  auVar257._8_4_ = 0;
  auVar257._0_8_ = uVar11;
  auVar257._12_2_ = uVar112;
  auVar257._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar11 >> 0x20);
  auVar256._12_4_ = auVar257._12_4_;
  auVar256._8_2_ = 0;
  auVar256._0_8_ = uVar11;
  auVar256._10_2_ = uVar112;
  auVar255._10_6_ = auVar256._10_6_;
  auVar255._8_2_ = uVar112;
  auVar255._0_8_ = uVar11;
  uVar112 = (undefined2)(uVar11 >> 0x10);
  auVar38._4_8_ = auVar255._8_8_;
  auVar38._2_2_ = uVar112;
  auVar38._0_2_ = uVar112;
  uVar12 = *(ulong *)(prim + uVar53 * 0x12 + 6);
  uVar112 = (undefined2)(uVar12 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar12;
  auVar86._12_2_ = uVar112;
  auVar86._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar12 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar12;
  auVar85._10_2_ = uVar112;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar112;
  auVar84._0_8_ = uVar12;
  uVar112 = (undefined2)(uVar12 >> 0x10);
  auVar39._4_8_ = auVar84._8_8_;
  auVar39._2_2_ = uVar112;
  auVar39._0_2_ = uVar112;
  fVar168 = (float)(auVar39._0_4_ >> 0x10);
  fVar233 = (float)(auVar84._8_4_ >> 0x10);
  uVar60 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar53 * 2 + uVar60 + 6);
  uVar112 = (undefined2)(uVar13 >> 0x30);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar13;
  auVar272._12_2_ = uVar112;
  auVar272._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar13 >> 0x20);
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._8_2_ = 0;
  auVar271._0_8_ = uVar13;
  auVar271._10_2_ = uVar112;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._8_2_ = uVar112;
  auVar270._0_8_ = uVar13;
  uVar112 = (undefined2)(uVar13 >> 0x10);
  auVar40._4_8_ = auVar270._8_8_;
  auVar40._2_2_ = uVar112;
  auVar40._0_2_ = uVar112;
  uVar60 = *(ulong *)(prim + uVar60 + 6);
  uVar112 = (undefined2)(uVar60 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar60;
  auVar89._12_2_ = uVar112;
  auVar89._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar60 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar60;
  auVar88._10_2_ = uVar112;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar112;
  auVar87._0_8_ = uVar60;
  uVar112 = (undefined2)(uVar60 >> 0x10);
  auVar41._4_8_ = auVar87._8_8_;
  auVar41._2_2_ = uVar112;
  auVar41._0_2_ = uVar112;
  fVar173 = (float)(auVar41._0_4_ >> 0x10);
  fVar238 = (float)(auVar87._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar53 * 0x18 + 6);
  uVar112 = (undefined2)(uVar14 >> 0x30);
  auVar282._8_4_ = 0;
  auVar282._0_8_ = uVar14;
  auVar282._12_2_ = uVar112;
  auVar282._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar14 >> 0x20);
  auVar281._12_4_ = auVar282._12_4_;
  auVar281._8_2_ = 0;
  auVar281._0_8_ = uVar14;
  auVar281._10_2_ = uVar112;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280._8_2_ = uVar112;
  auVar280._0_8_ = uVar14;
  uVar112 = (undefined2)(uVar14 >> 0x10);
  auVar42._4_8_ = auVar280._8_8_;
  auVar42._2_2_ = uVar112;
  auVar42._0_2_ = uVar112;
  uVar15 = *(ulong *)(prim + uVar53 * 0x1d + 6);
  uVar112 = (undefined2)(uVar15 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar15;
  auVar92._12_2_ = uVar112;
  auVar92._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar15 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar15;
  auVar91._10_2_ = uVar112;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar112;
  auVar90._0_8_ = uVar15;
  uVar112 = (undefined2)(uVar15 >> 0x10);
  auVar43._4_8_ = auVar90._8_8_;
  auVar43._2_2_ = uVar112;
  auVar43._0_2_ = uVar112;
  fVar191 = (float)(auVar43._0_4_ >> 0x10);
  fVar244 = (float)(auVar90._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar53 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar112 = (undefined2)(uVar16 >> 0x30);
  auVar295._8_4_ = 0;
  auVar295._0_8_ = uVar16;
  auVar295._12_2_ = uVar112;
  auVar295._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar16 >> 0x20);
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._8_2_ = 0;
  auVar294._0_8_ = uVar16;
  auVar294._10_2_ = uVar112;
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._8_2_ = uVar112;
  auVar293._0_8_ = uVar16;
  uVar112 = (undefined2)(uVar16 >> 0x10);
  auVar44._4_8_ = auVar293._8_8_;
  auVar44._2_2_ = uVar112;
  auVar44._0_2_ = uVar112;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar53) + 6);
  uVar112 = (undefined2)(uVar17 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar17;
  auVar95._12_2_ = uVar112;
  auVar95._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar17 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar17;
  auVar94._10_2_ = uVar112;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar112;
  auVar93._0_8_ = uVar17;
  uVar112 = (undefined2)(uVar17 >> 0x10);
  auVar45._4_8_ = auVar93._8_8_;
  auVar45._2_2_ = uVar112;
  auVar45._0_2_ = uVar112;
  fVar192 = (float)(auVar45._0_4_ >> 0x10);
  fVar247 = (float)(auVar93._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar53 * 0x23 + 6);
  uVar112 = (undefined2)(uVar53 >> 0x30);
  auVar306._8_4_ = 0;
  auVar306._0_8_ = uVar53;
  auVar306._12_2_ = uVar112;
  auVar306._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar53 >> 0x20);
  auVar305._12_4_ = auVar306._12_4_;
  auVar305._8_2_ = 0;
  auVar305._0_8_ = uVar53;
  auVar305._10_2_ = uVar112;
  auVar304._10_6_ = auVar305._10_6_;
  auVar304._8_2_ = uVar112;
  auVar304._0_8_ = uVar53;
  uVar112 = (undefined2)(uVar53 >> 0x10);
  auVar46._4_8_ = auVar304._8_8_;
  auVar46._2_2_ = uVar112;
  auVar46._0_2_ = uVar112;
  auVar178._0_8_ =
       CONCAT44(((((float)(auVar36._0_4_ >> 0x10) - fVar154) * fVar284 + fVar154) - fVar321) *
                fVar115,((((float)(int)(short)uVar9 - (float)(int)(short)uVar65) * fVar284 +
                         (float)(int)(short)uVar65) - fVar316) * fVar170);
  auVar178._8_4_ =
       ((((float)(auVar175._8_4_ >> 0x10) - fVar207) * fVar284 + fVar207) - fVar322) * fVar196;
  auVar178._12_4_ =
       ((((float)(auVar176._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar284 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar323) * fVar252;
  auVar258._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar284 +
        (float)(int)(short)uVar10) - fVar316) * fVar170;
  auVar258._4_4_ =
       ((((float)(auVar38._0_4_ >> 0x10) - fVar157) * fVar284 + fVar157) - fVar321) * fVar115;
  auVar258._8_4_ =
       ((((float)(auVar255._8_4_ >> 0x10) - fVar230) * fVar284 + fVar230) - fVar322) * fVar196;
  auVar258._12_4_ =
       ((((float)(auVar256._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar284 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar323) * fVar252;
  auVar273._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar168) * fVar284 + fVar168) - fVar276) *
                fVar119,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar284 +
                         (float)(int)(short)uVar12) - fVar269) * fVar75);
  auVar273._8_4_ =
       ((((float)(auVar270._8_4_ >> 0x10) - fVar233) * fVar284 + fVar233) - fVar277) * fVar205;
  auVar273._12_4_ =
       ((((float)(auVar271._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar284 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar315) * fVar260;
  auVar283._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar60) * fVar284 +
        (float)(int)(short)uVar60) - fVar269) * fVar75;
  auVar283._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar173) * fVar284 + fVar173) - fVar276) * fVar119;
  auVar283._8_4_ =
       ((((float)(auVar280._8_4_ >> 0x10) - fVar238) * fVar284 + fVar238) - fVar277) * fVar205;
  auVar283._12_4_ =
       ((((float)(auVar281._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar284 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar315) * fVar260;
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar296._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar191) * fVar284 + fVar191) - fVar267) *
                fVar152,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar284 +
                         (float)(int)(short)uVar15) - fVar265) * fVar113);
  auVar296._8_4_ =
       ((((float)(auVar293._8_4_ >> 0x10) - fVar244) * fVar284 + fVar244) - fVar268) * fVar206;
  auVar296._12_4_ =
       ((((float)(auVar294._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar284 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar278) * fVar262;
  auVar307._0_4_ =
       ((((float)(int)(short)uVar53 - (float)(int)(short)uVar17) * fVar284 +
        (float)(int)(short)uVar17) - fVar265) * fVar113;
  auVar307._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar192) * fVar284 + fVar192) - fVar267) * fVar152;
  auVar307._8_4_ =
       ((((float)(auVar304._8_4_ >> 0x10) - fVar247) * fVar284 + fVar247) - fVar268) * fVar206;
  auVar307._12_4_ =
       ((((float)(auVar305._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar284 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar278) * fVar262;
  auVar159._8_4_ = auVar178._8_4_;
  auVar159._0_8_ = auVar178._0_8_;
  auVar159._12_4_ = auVar178._12_4_;
  auVar160 = minps(auVar159,auVar258);
  auVar130._8_4_ = auVar273._8_4_;
  auVar130._0_8_ = auVar273._0_8_;
  auVar130._12_4_ = auVar273._12_4_;
  auVar77 = minps(auVar130,auVar283);
  auVar160 = maxps(auVar160,auVar77);
  auVar131._8_4_ = auVar296._8_4_;
  auVar131._0_8_ = auVar296._0_8_;
  auVar131._12_4_ = auVar296._12_4_;
  auVar77 = minps(auVar131,auVar307);
  auVar96._4_4_ = uVar58;
  auVar96._0_4_ = uVar58;
  auVar96._8_4_ = uVar58;
  auVar96._12_4_ = uVar58;
  auVar77 = maxps(auVar77,auVar96);
  auVar77 = maxps(auVar160,auVar77);
  auVar160 = maxps(auVar178,auVar258);
  auVar274 = maxps(auVar273,auVar283);
  auVar160 = minps(auVar160,auVar274);
  local_48 = auVar77._0_4_ * 0.99999964;
  fStack_44 = auVar77._4_4_ * 0.99999964;
  fStack_40 = auVar77._8_4_ * 0.99999964;
  fStack_3c = auVar77._12_4_ * 0.99999964;
  auVar77 = maxps(auVar296,auVar307);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar97._4_4_ = uVar58;
  auVar97._0_4_ = uVar58;
  auVar97._8_4_ = uVar58;
  auVar97._12_4_ = uVar58;
  auVar77 = minps(auVar77,auVar97);
  auVar77 = minps(auVar160,auVar77);
  uVar66 = (uint)(byte)PVar18;
  auVar132._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar77._0_4_ * 1.0000004);
  auVar132._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar77._4_4_ * 1.0000004);
  auVar132._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar77._8_4_ * 1.0000004);
  auVar132._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar77._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar132);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_228 = pre->ray_space + k;
    local_3a8 = mm_lookupmask_ps._0_8_;
    uStack_3a0 = mm_lookupmask_ps._8_8_;
    local_2c0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_3c0 = pre;
    local_220 = prim;
    do {
      lVar22 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      uVar67 = *(uint *)(local_220 + 2);
      pRVar61 = (RTCIntersectArguments *)(ulong)uVar67;
      uVar69 = *(uint *)(local_220 + lVar22 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[(long)pRVar61].ptr;
      uVar65 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                               (ulong)uVar69 *
                               pGVar20[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar170 = pGVar20->fnumTimeSegments;
      fVar75 = (pGVar20->time_range).lower;
      fVar113 = ((*(float *)(ray + k * 4 + 0x70) - fVar75) / ((pGVar20->time_range).upper - fVar75))
                * fVar170;
      fVar75 = floorf(fVar113);
      fVar170 = fVar170 + -1.0;
      if (fVar170 <= fVar75) {
        fVar75 = fVar170;
      }
      fVar170 = 0.0;
      if (0.0 <= fVar75) {
        fVar170 = fVar75;
      }
      _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar62 = (Geometry *)((long)(int)fVar170 * 0x38);
      lVar22 = *(long *)((long)&pGVar62->device + _Var21);
      lVar63 = *(long *)((long)&pGVar62->modCounter_ + _Var21);
      lVar64 = *(long *)((long)&pGVar62->occlusionFilterN + _Var21);
      pfVar1 = (float *)(lVar63 + uVar65 * lVar64);
      pfVar2 = (float *)(lVar63 + (uVar65 + 1) * lVar64);
      pfVar3 = (float *)(lVar63 + (uVar65 + 2) * lVar64);
      fVar113 = fVar113 - fVar170;
      fVar170 = 1.0 - fVar113;
      pfVar4 = (float *)(lVar63 + lVar64 * (uVar65 + 3));
      lVar63 = *(long *)((long)&(pGVar62->super_RefCount)._vptr_RefCount + _Var21);
      pfVar5 = (float *)(lVar63 + lVar22 * uVar65);
      pfVar6 = (float *)(lVar63 + lVar22 * (uVar65 + 1));
      local_398 = *pfVar5 * fVar170 + *pfVar1 * fVar113;
      fStack_394 = pfVar5[1] * fVar170 + pfVar1[1] * fVar113;
      fStack_390 = pfVar5[2] * fVar170 + pfVar1[2] * fVar113;
      fStack_38c = pfVar5[3] * fVar170 + pfVar1[3] * fVar113;
      fVar244 = *pfVar6 * fVar170 + *pfVar2 * fVar113;
      fVar247 = pfVar6[1] * fVar170 + pfVar2[1] * fVar113;
      fVar252 = pfVar6[2] * fVar170 + pfVar2[2] * fVar113;
      fStack_28c = pfVar6[3] * fVar170 + pfVar2[3] * fVar113;
      pfVar1 = (float *)(lVar63 + lVar22 * (uVar65 + 2));
      fVar262 = *pfVar1 * fVar170 + *pfVar3 * fVar113;
      fVar269 = pfVar1[1] * fVar170 + pfVar3[1] * fVar113;
      fVar276 = pfVar1[2] * fVar170 + pfVar3[2] * fVar113;
      fStack_29c = pfVar1[3] * fVar170 + pfVar3[3] * fVar113;
      pfVar1 = (float *)(lVar63 + lVar22 * (uVar65 + 3));
      fVar230 = fVar170 * *pfVar1 + fVar113 * *pfVar4;
      fVar233 = fVar170 * pfVar1[1] + fVar113 * pfVar4[1];
      fVar238 = fVar170 * pfVar1[2] + fVar113 * pfVar4[2];
      fStack_27c = fVar170 * pfVar1[3] + fVar113 * pfVar4[3];
      iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar170 = *(float *)(ray + k * 4);
      fVar75 = *(float *)(ray + k * 4 + 0x10);
      fVar113 = *(float *)(ray + k * 4 + 0x20);
      fVar196 = local_398 - fVar170;
      fVar205 = fStack_394 - fVar75;
      fVar206 = fStack_390 - fVar113;
      fVar115 = (local_228->vx).field_0.m128[0];
      fVar119 = (local_228->vx).field_0.m128[1];
      fVar152 = (local_228->vx).field_0.m128[2];
      fVar154 = (local_228->vy).field_0.m128[0];
      fVar157 = (local_228->vy).field_0.m128[1];
      fVar168 = (local_228->vy).field_0.m128[2];
      fVar173 = (local_228->vz).field_0.m128[0];
      fVar191 = (local_228->vz).field_0.m128[1];
      fVar192 = (local_228->vz).field_0.m128[2];
      local_128 = fVar196 * fVar115 + fVar205 * fVar154 + fVar206 * fVar173;
      local_248 = fVar196 * fVar119 + fVar205 * fVar157 + fVar206 * fVar191;
      fVar196 = fVar196 * fVar152 + fVar205 * fVar168 + fVar206 * fVar192;
      fVar205 = fVar244 - fVar170;
      fVar206 = fVar247 - fVar75;
      fVar207 = fVar252 - fVar113;
      fVar277 = fVar205 * fVar115 + fVar206 * fVar154 + fVar207 * fVar173;
      fVar315 = fVar205 * fVar119 + fVar206 * fVar157 + fVar207 * fVar191;
      local_2f8 = fVar205 * fVar152 + fVar206 * fVar168 + fVar207 * fVar192;
      fVar205 = fVar262 - fVar170;
      fVar206 = fVar269 - fVar75;
      fVar207 = fVar276 - fVar113;
      fVar260 = fVar205 * fVar115 + fVar206 * fVar154 + fVar207 * fVar173;
      local_2d8 = fVar205 * fVar119 + fVar206 * fVar157 + fVar207 * fVar191;
      local_308 = fVar205 * fVar152 + fVar206 * fVar168 + fVar207 * fVar192;
      fVar170 = fVar230 - fVar170;
      fVar75 = fVar233 - fVar75;
      fVar113 = fVar238 - fVar113;
      fVar115 = fVar170 * fVar115 + fVar75 * fVar154 + fVar113 * fVar173;
      local_2e8 = fVar170 * fVar119 + fVar75 * fVar157 + fVar113 * fVar191;
      local_318 = fVar170 * fVar152 + fVar75 * fVar168 + fVar113 * fVar192;
      auVar179._0_8_ = CONCAT44(local_248,local_128) & 0x7fffffff7fffffff;
      auVar179._8_4_ = ABS(fVar196);
      auVar179._12_4_ = ABS(fStack_38c);
      auVar197._0_8_ = CONCAT44(fVar315,fVar277) & 0x7fffffff7fffffff;
      auVar197._8_4_ = ABS(local_2f8);
      auVar197._12_4_ = ABS(fStack_28c);
      auVar77 = maxps(auVar179,auVar197);
      auVar225._0_8_ = CONCAT44(local_2d8,fVar260) & 0x7fffffff7fffffff;
      auVar225._8_4_ = ABS(local_308);
      auVar225._12_4_ = ABS(fStack_29c);
      auVar133._0_8_ = CONCAT44(local_2e8,fVar115) & 0x7fffffff7fffffff;
      auVar133._8_4_ = ABS(local_318);
      auVar133._12_4_ = ABS(fStack_27c);
      auVar160 = maxps(auVar225,auVar133);
      auVar77 = maxps(auVar77,auVar160);
      uVar117 = auVar77._8_8_;
      fVar170 = auVar77._4_4_;
      if (auVar77._4_4_ <= auVar77._0_4_) {
        fVar170 = auVar77._0_4_;
      }
      auVar180._8_8_ = uVar117;
      auVar180._0_8_ = uVar117;
      fVar75 = (float)iVar19;
      _local_2b8 = ZEXT416((uint)fVar75);
      if (auVar77._8_4_ <= fVar170) {
        auVar181._4_12_ = auVar180._4_12_;
        auVar181._0_4_ = fVar170;
        uVar117 = auVar181._0_8_;
      }
      pRVar59 = (RTCIntersectArguments *)((long)iVar19 * 0x40);
      lVar22 = (long)iVar19 * 0x44;
      fVar113 = *(float *)(bezier_basis0 + lVar22 + 0x908);
      fVar119 = *(float *)(bezier_basis0 + lVar22 + 0x90c);
      fVar152 = *(float *)(bezier_basis0 + lVar22 + 0x910);
      fVar154 = *(float *)(bezier_basis0 + lVar22 + 0x914);
      fVar157 = *(float *)(bezier_basis0 + lVar22 + 0xd8c);
      fVar168 = *(float *)(bezier_basis0 + lVar22 + 0xd90);
      fVar173 = *(float *)(bezier_basis0 + lVar22 + 0xd94);
      fVar191 = *(float *)(bezier_basis0 + lVar22 + 0xd98);
      local_358 = *(float *)(bezier_basis0 + lVar22 + 0x484);
      fStack_354 = *(float *)(bezier_basis0 + lVar22 + 0x488);
      fStack_350 = *(float *)(bezier_basis0 + lVar22 + 0x48c);
      fStack_34c = *(float *)(bezier_basis0 + lVar22 + 0x490);
      pauVar7 = (undefined1 (*) [16])(bezier_basis0 + lVar22);
      fVar170 = *(float *)*pauVar7;
      fVar192 = *(float *)(bezier_basis0 + lVar22 + 4);
      fVar205 = *(float *)(bezier_basis0 + lVar22 + 8);
      auVar26 = *(undefined1 (*) [12])*pauVar7;
      fVar206 = *(float *)(bezier_basis0 + lVar22 + 0xc);
      _local_258 = *pauVar7;
      local_348 = local_128 * fVar170 + fVar277 * local_358 + fVar260 * fVar113 + fVar115 * fVar157;
      fStack_344 = local_128 * fVar192 +
                   fVar277 * fStack_354 + fVar260 * fVar119 + fVar115 * fVar168;
      fStack_340 = local_128 * fVar205 +
                   fVar277 * fStack_350 + fVar260 * fVar152 + fVar115 * fVar173;
      fStack_33c = local_128 * fVar206 +
                   fVar277 * fStack_34c + fVar260 * fVar154 + fVar115 * fVar191;
      fVar208 = local_248 * fVar170 +
                fVar315 * local_358 + local_2d8 * fVar113 + local_2e8 * fVar157;
      fVar231 = local_248 * fVar192 +
                fVar315 * fStack_354 + local_2d8 * fVar119 + local_2e8 * fVar168;
      fVar234 = local_248 * fVar205 +
                fVar315 * fStack_350 + local_2d8 * fVar152 + local_2e8 * fVar173;
      fVar236 = local_248 * fVar206 +
                fVar315 * fStack_34c + local_2d8 * fVar154 + local_2e8 * fVar191;
      auVar308._0_4_ =
           fStack_38c * fVar170 +
           fStack_28c * local_358 + fStack_29c * fVar113 + fStack_27c * fVar157;
      auVar308._4_4_ =
           fStack_38c * fVar192 +
           fStack_28c * fStack_354 + fStack_29c * fVar119 + fStack_27c * fVar168;
      auVar308._8_4_ =
           fStack_38c * fVar205 +
           fStack_28c * fStack_350 + fStack_29c * fVar152 + fStack_27c * fVar173;
      auVar308._12_4_ =
           fStack_38c * fVar206 +
           fStack_28c * fStack_34c + fStack_29c * fVar154 + fStack_27c * fVar191;
      fVar192 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fVar205 = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fVar207 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fVar265 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fVar267 = *(float *)(bezier_basis1 + lVar22 + 0x908);
      fVar268 = *(float *)(bezier_basis1 + lVar22 + 0x90c);
      fVar278 = *(float *)(bezier_basis1 + lVar22 + 0x910);
      fVar284 = *(float *)(bezier_basis1 + lVar22 + 0x914);
      local_138 = fStack_27c;
      fStack_134 = fStack_27c;
      fStack_130 = fStack_27c;
      fStack_12c = fStack_27c;
      fVar286 = *(float *)(bezier_basis1 + lVar22 + 0x484);
      fVar291 = *(float *)(bezier_basis1 + lVar22 + 0x488);
      fVar298 = *(float *)(bezier_basis1 + lVar22 + 0x48c);
      fVar299 = *(float *)(bezier_basis1 + lVar22 + 0x490);
      local_148 = fStack_28c;
      fStack_144 = fStack_28c;
      fStack_140 = fStack_28c;
      fStack_13c = fStack_28c;
      fVar300 = *(float *)(bezier_basis1 + lVar22);
      fVar301 = *(float *)(bezier_basis1 + lVar22 + 4);
      fVar311 = *(float *)(bezier_basis1 + lVar22 + 8);
      fVar313 = *(float *)(bezier_basis1 + lVar22 + 0xc);
      fStack_124 = local_128;
      fStack_120 = local_128;
      fStack_11c = local_128;
      fVar239 = local_128 * fVar300 + fVar277 * fVar286 + fVar260 * fVar267 + fVar115 * fVar192;
      fVar245 = local_128 * fVar301 + fVar277 * fVar291 + fVar260 * fVar268 + fVar115 * fVar205;
      fVar248 = local_128 * fVar311 + fVar277 * fVar298 + fVar260 * fVar278 + fVar115 * fVar207;
      fVar250 = local_128 * fVar313 + fVar277 * fVar299 + fVar260 * fVar284 + fVar115 * fVar265;
      fVar314 = local_248 * fVar300 + fVar315 * fVar286 + local_2d8 * fVar267 + local_2e8 * fVar192;
      fVar321 = local_248 * fVar301 + fVar315 * fVar291 + local_2d8 * fVar268 + local_2e8 * fVar205;
      fVar323 = local_248 * fVar311 + fVar315 * fVar298 + local_2d8 * fVar278 + local_2e8 * fVar207;
      fVar194 = local_248 * fVar313 + fVar315 * fVar299 + local_2d8 * fVar284 + local_2e8 * fVar265;
      local_158 = fStack_38c;
      fStack_154 = fStack_38c;
      fStack_150 = fStack_38c;
      fStack_14c = fStack_38c;
      fVar327 = fStack_38c * fVar300 +
                fStack_28c * fVar286 + fStack_29c * fVar267 + fStack_27c * fVar192;
      fVar329 = fStack_38c * fVar301 +
                fStack_28c * fVar291 + fStack_29c * fVar268 + fStack_27c * fVar205;
      fVar331 = fStack_38c * fVar311 +
                fStack_28c * fVar298 + fStack_29c * fVar278 + fStack_27c * fVar207;
      fVar333 = fStack_38c * fVar313 +
                fStack_28c * fVar299 + fStack_29c * fVar284 + fStack_27c * fVar265;
      fVar240 = fVar239 - local_348;
      fVar246 = fVar245 - fStack_344;
      fVar249 = fVar248 - fStack_340;
      fVar251 = fVar250 - fStack_33c;
      fVar316 = fVar314 - fVar208;
      fVar322 = fVar321 - fVar231;
      fVar193 = fVar323 - fVar234;
      fVar195 = fVar194 - fVar236;
      local_328 = CONCAT44(fVar231,fVar208);
      uStack_320 = CONCAT44(fVar236,fVar234);
      fVar170 = fVar208 * fVar240 - local_348 * fVar316;
      fVar232 = fVar231 * fVar246 - fStack_344 * fVar322;
      fVar235 = fVar234 * fVar249 - fStack_340 * fVar193;
      fVar237 = fVar236 * fVar251 - fStack_33c * fVar195;
      auVar23._4_4_ = fVar329;
      auVar23._0_4_ = fVar327;
      auVar23._8_4_ = fVar331;
      auVar23._12_4_ = fVar333;
      auVar77 = maxps(auVar308,auVar23);
      bVar47 = fVar170 * fVar170 <=
               auVar77._0_4_ * auVar77._0_4_ * (fVar240 * fVar240 + fVar316 * fVar316) &&
               0.0 < fVar75;
      local_338._0_4_ = -(uint)bVar47;
      bVar48 = fVar232 * fVar232 <=
               auVar77._4_4_ * auVar77._4_4_ * (fVar246 * fVar246 + fVar322 * fVar322) &&
               1.0 < fVar75;
      local_338._4_4_ = -(uint)bVar48;
      bVar49 = fVar235 * fVar235 <=
               auVar77._8_4_ * auVar77._8_4_ * (fVar249 * fVar249 + fVar193 * fVar193) &&
               2.0 < fVar75;
      fStack_330 = (float)-(uint)bVar49;
      bVar50 = fVar237 * fVar237 <=
               auVar77._12_4_ * auVar77._12_4_ * (fVar251 * fVar251 + fVar195 * fVar195) &&
               3.0 < fVar75;
      fStack_32c = (float)-(uint)bVar50;
      local_438 = (float)uVar117;
      local_438 = local_438 * 4.7683716e-07;
      iVar52 = movmskps(iVar19,_local_338);
      fVar170 = *(float *)(ray + k * 4 + 0x30);
      _local_278 = ZEXT416((uint)fVar170);
      fStack_314 = local_318;
      fStack_310 = local_318;
      fStack_30c = local_318;
      fStack_304 = local_308;
      fStack_300 = local_308;
      fStack_2fc = local_308;
      fStack_2f4 = local_2f8;
      fStack_2f0 = local_2f8;
      fStack_2ec = local_2f8;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      local_2a8 = fVar262;
      fStack_2a4 = fVar269;
      fStack_2a0 = fVar276;
      local_298 = fVar244;
      fStack_294 = fVar247;
      fStack_290 = fVar252;
      local_288 = fVar230;
      fStack_284 = fVar233;
      fStack_280 = fVar238;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      local_238 = fStack_29c;
      fStack_234 = fStack_29c;
      fStack_230 = fStack_29c;
      fStack_22c = fStack_29c;
      if (iVar52 != 0) {
        fVar158 = fVar192 * local_318 + fVar267 * local_308 + fVar286 * local_2f8 +
                  fVar300 * fVar196;
        fVar169 = fVar205 * local_318 + fVar268 * local_308 + fVar291 * local_2f8 +
                  fVar301 * fVar196;
        fVar171 = fVar207 * local_318 + fVar278 * local_308 + fVar298 * local_2f8 +
                  fVar311 * fVar196;
        fVar172 = fVar265 * local_318 + fVar284 * local_308 + fVar299 * local_2f8 +
                  fVar313 * fVar196;
        local_258._0_4_ = auVar26._0_4_;
        local_258._4_4_ = auVar26._4_4_;
        fStack_250 = auVar26._8_4_;
        fVar76 = fVar157 * local_318 + fVar113 * local_308 + local_358 * local_2f8 +
                 (float)local_258._0_4_ * fVar196;
        fVar114 = fVar168 * local_318 + fVar119 * local_308 + fStack_354 * local_2f8 +
                  (float)local_258._4_4_ * fVar196;
        fVar116 = fVar173 * local_318 + fVar152 * local_308 + fStack_350 * local_2f8 +
                  fStack_250 * fVar196;
        fVar118 = fVar191 * local_318 + fVar154 * local_308 + fStack_34c * local_2f8 +
                  fVar206 * fVar196;
        fVar113 = *(float *)(bezier_basis0 + lVar22 + 0x1210);
        fVar119 = *(float *)(bezier_basis0 + lVar22 + 0x1214);
        fVar152 = *(float *)(bezier_basis0 + lVar22 + 0x1218);
        fVar154 = *(float *)(bezier_basis0 + lVar22 + 0x121c);
        fVar157 = *(float *)(bezier_basis0 + lVar22 + 0x1694);
        fVar168 = *(float *)(bezier_basis0 + lVar22 + 0x1698);
        fVar173 = *(float *)(bezier_basis0 + lVar22 + 0x169c);
        fVar191 = *(float *)(bezier_basis0 + lVar22 + 0x16a0);
        fVar192 = *(float *)(bezier_basis0 + lVar22 + 0x1b18);
        fVar205 = *(float *)(bezier_basis0 + lVar22 + 0x1b1c);
        fVar206 = *(float *)(bezier_basis0 + lVar22 + 0x1b20);
        fVar207 = *(float *)(bezier_basis0 + lVar22 + 0x1b24);
        fVar265 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar267 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar268 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar278 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar279 = local_128 * fVar113 + fVar277 * fVar157 + fVar260 * fVar192 + fVar115 * fVar265;
        fVar285 = local_128 * fVar119 + fVar277 * fVar168 + fVar260 * fVar205 + fVar115 * fVar267;
        fVar287 = local_128 * fVar152 + fVar277 * fVar173 + fVar260 * fVar206 + fVar115 * fVar268;
        fVar289 = local_128 * fVar154 + fVar277 * fVar191 + fVar260 * fVar207 + fVar115 * fVar278;
        fVar328 = local_248 * fVar113 +
                  fVar315 * fVar157 + local_2d8 * fVar192 + local_2e8 * fVar265;
        fVar330 = local_248 * fVar119 +
                  fVar315 * fVar168 + local_2d8 * fVar205 + local_2e8 * fVar267;
        fVar332 = local_248 * fVar152 +
                  fVar315 * fVar173 + local_2d8 * fVar206 + local_2e8 * fVar268;
        fVar334 = local_248 * fVar154 +
                  fVar315 * fVar191 + local_2d8 * fVar207 + local_2e8 * fVar278;
        fVar284 = *(float *)(bezier_basis1 + lVar22 + 0x1210);
        fVar286 = *(float *)(bezier_basis1 + lVar22 + 0x1214);
        fVar291 = *(float *)(bezier_basis1 + lVar22 + 0x1218);
        fVar298 = *(float *)(bezier_basis1 + lVar22 + 0x121c);
        fVar299 = *(float *)(bezier_basis1 + lVar22 + 0x1b18);
        fVar300 = *(float *)(bezier_basis1 + lVar22 + 0x1b1c);
        fVar301 = *(float *)(bezier_basis1 + lVar22 + 0x1b20);
        fVar311 = *(float *)(bezier_basis1 + lVar22 + 0x1b24);
        fVar313 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar232 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar235 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar237 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar288 = *(float *)(bezier_basis1 + lVar22 + 0x1694);
        fVar290 = *(float *)(bezier_basis1 + lVar22 + 0x1698);
        fVar302 = *(float *)(bezier_basis1 + lVar22 + 0x169c);
        fVar312 = *(float *)(bezier_basis1 + lVar22 + 0x16a0);
        auVar198._0_4_ = fVar277 * fVar288 + fVar260 * fVar299 + fVar115 * fVar313;
        auVar198._4_4_ = fVar277 * fVar290 + fVar260 * fVar300 + fVar115 * fVar232;
        auVar198._8_4_ = fVar277 * fVar302 + fVar260 * fVar301 + fVar115 * fVar235;
        auVar198._12_4_ = fVar277 * fVar312 + fVar260 * fVar311 + fVar115 * fVar237;
        fVar253 = local_128 * fVar284 + auVar198._0_4_;
        fVar261 = local_128 * fVar286 + auVar198._4_4_;
        fVar263 = local_128 * fVar291 + auVar198._8_4_;
        fVar264 = local_128 * fVar298 + auVar198._12_4_;
        fVar120 = local_248 * fVar284 +
                  fVar315 * fVar288 + local_2d8 * fVar299 + local_2e8 * fVar313;
        fVar153 = local_248 * fVar286 +
                  fVar315 * fVar290 + local_2d8 * fVar300 + local_2e8 * fVar232;
        fVar155 = local_248 * fVar291 +
                  fVar315 * fVar302 + local_2d8 * fVar301 + local_2e8 * fVar235;
        fVar156 = local_248 * fVar298 +
                  fVar315 * fVar312 + local_2d8 * fVar311 + local_2e8 * fVar237;
        auVar309._0_8_ = CONCAT44(fVar285,fVar279) & 0x7fffffff7fffffff;
        auVar309._8_4_ = ABS(fVar287);
        auVar309._12_4_ = ABS(fVar289);
        auVar266._0_8_ = CONCAT44(fVar330,fVar328) & 0x7fffffff7fffffff;
        auVar266._8_4_ = ABS(fVar332);
        auVar266._12_4_ = ABS(fVar334);
        auVar77 = maxps(auVar309,auVar266);
        auVar317._0_8_ =
             CONCAT44(fVar119 * fVar196 +
                      fVar168 * local_2f8 + fVar205 * local_308 + fVar267 * local_318,
                      fVar113 * fVar196 +
                      fVar157 * local_2f8 + fVar192 * local_308 + fVar265 * local_318) &
             0x7fffffff7fffffff;
        auVar317._8_4_ =
             ABS(fVar152 * fVar196 + fVar173 * local_2f8 + fVar206 * local_308 + fVar268 * local_318
                );
        auVar317._12_4_ =
             ABS(fVar154 * fVar196 + fVar191 * local_2f8 + fVar207 * local_308 + fVar278 * local_318
                );
        auVar77 = maxps(auVar77,auVar317);
        uVar71 = -(uint)(local_438 <= auVar77._0_4_);
        uVar68 = -(uint)(local_438 <= auVar77._4_4_);
        uVar70 = -(uint)(local_438 <= auVar77._8_4_);
        uVar72 = -(uint)(local_438 <= auVar77._12_4_);
        fVar192 = (float)((uint)fVar279 & uVar71 | ~uVar71 & (uint)fVar240);
        fVar205 = (float)((uint)fVar285 & uVar68 | ~uVar68 & (uint)fVar246);
        fVar206 = (float)((uint)fVar287 & uVar70 | ~uVar70 & (uint)fVar249);
        fVar207 = (float)((uint)fVar289 & uVar72 | ~uVar72 & (uint)fVar251);
        fVar278 = (float)(~uVar71 & (uint)fVar316 | (uint)fVar328 & uVar71);
        fVar279 = (float)(~uVar68 & (uint)fVar322 | (uint)fVar330 & uVar68);
        fVar285 = (float)(~uVar70 & (uint)fVar193 | (uint)fVar332 & uVar70);
        fVar287 = (float)(~uVar72 & (uint)fVar195 | (uint)fVar334 & uVar72);
        auVar318._0_8_ = CONCAT44(fVar261,fVar253) & 0x7fffffff7fffffff;
        auVar318._8_4_ = ABS(fVar263);
        auVar318._12_4_ = ABS(fVar264);
        auVar275._0_8_ = CONCAT44(fVar153,fVar120) & 0x7fffffff7fffffff;
        auVar275._8_4_ = ABS(fVar155);
        auVar275._12_4_ = ABS(fVar156);
        auVar77 = maxps(auVar318,auVar275);
        auVar242._0_8_ =
             CONCAT44(fVar286 * fVar196 +
                      fVar290 * local_2f8 + fVar300 * local_308 + fVar232 * local_318,
                      fVar284 * fVar196 +
                      fVar288 * local_2f8 + fVar299 * local_308 + fVar313 * local_318) &
             0x7fffffff7fffffff;
        auVar242._8_4_ =
             ABS(fVar291 * fVar196 + fVar302 * local_2f8 + fVar301 * local_308 + fVar235 * local_318
                );
        auVar242._12_4_ =
             ABS(fVar298 * fVar196 + fVar312 * local_2f8 + fVar311 * local_308 + fVar237 * local_318
                );
        auVar77 = maxps(auVar77,auVar242);
        uVar71 = -(uint)(local_438 <= auVar77._0_4_);
        uVar68 = -(uint)(local_438 <= auVar77._4_4_);
        uVar70 = -(uint)(local_438 <= auVar77._8_4_);
        uVar72 = -(uint)(local_438 <= auVar77._12_4_);
        fVar157 = (float)((uint)fVar253 & uVar71 | ~uVar71 & (uint)fVar240);
        fVar168 = (float)((uint)fVar261 & uVar68 | ~uVar68 & (uint)fVar246);
        fVar173 = (float)((uint)fVar263 & uVar70 | ~uVar70 & (uint)fVar249);
        fVar191 = (float)((uint)fVar264 & uVar72 | ~uVar72 & (uint)fVar251);
        fVar286 = (float)(~uVar71 & (uint)fVar316 | (uint)fVar120 & uVar71);
        fVar291 = (float)(~uVar68 & (uint)fVar322 | (uint)fVar153 & uVar68);
        fVar298 = (float)(~uVar70 & (uint)fVar193 | (uint)fVar155 & uVar70);
        fVar299 = (float)(~uVar72 & (uint)fVar195 | (uint)fVar156 & uVar72);
        auVar134._0_4_ = fVar278 * fVar278 + fVar192 * fVar192;
        auVar134._4_4_ = fVar279 * fVar279 + fVar205 * fVar205;
        auVar134._8_4_ = fVar285 * fVar285 + fVar206 * fVar206;
        auVar134._12_4_ = fVar287 * fVar287 + fVar207 * fVar207;
        auVar77 = rsqrtps(auVar198,auVar134);
        fVar113 = auVar77._0_4_;
        fVar119 = auVar77._4_4_;
        fVar152 = auVar77._8_4_;
        fVar154 = auVar77._12_4_;
        auVar199._0_4_ = fVar113 * fVar113 * auVar134._0_4_ * 0.5 * fVar113;
        auVar199._4_4_ = fVar119 * fVar119 * auVar134._4_4_ * 0.5 * fVar119;
        auVar199._8_4_ = fVar152 * fVar152 * auVar134._8_4_ * 0.5 * fVar152;
        auVar199._12_4_ = fVar154 * fVar154 * auVar134._12_4_ * 0.5 * fVar154;
        fVar300 = fVar113 * 1.5 - auVar199._0_4_;
        fVar301 = fVar119 * 1.5 - auVar199._4_4_;
        fVar311 = fVar152 * 1.5 - auVar199._8_4_;
        fVar313 = fVar154 * 1.5 - auVar199._12_4_;
        auVar135._0_4_ = fVar286 * fVar286 + fVar157 * fVar157;
        auVar135._4_4_ = fVar291 * fVar291 + fVar168 * fVar168;
        auVar135._8_4_ = fVar298 * fVar298 + fVar173 * fVar173;
        auVar135._12_4_ = fVar299 * fVar299 + fVar191 * fVar191;
        auVar77 = rsqrtps(auVar199,auVar135);
        fVar113 = auVar77._0_4_;
        fVar119 = auVar77._4_4_;
        fVar152 = auVar77._8_4_;
        fVar154 = auVar77._12_4_;
        fVar265 = fVar113 * 1.5 - fVar113 * fVar113 * auVar135._0_4_ * 0.5 * fVar113;
        fVar267 = fVar119 * 1.5 - fVar119 * fVar119 * auVar135._4_4_ * 0.5 * fVar119;
        fVar268 = fVar152 * 1.5 - fVar152 * fVar152 * auVar135._8_4_ * 0.5 * fVar152;
        fVar284 = fVar154 * 1.5 - fVar154 * fVar154 * auVar135._12_4_ * 0.5 * fVar154;
        fVar302 = fVar278 * fVar300 * auVar308._0_4_;
        fVar312 = fVar279 * fVar301 * auVar308._4_4_;
        fVar155 = fVar285 * fVar311 * auVar308._8_4_;
        fVar253 = fVar287 * fVar313 * auVar308._12_4_;
        fVar192 = -fVar192 * fVar300 * auVar308._0_4_;
        fVar205 = -fVar205 * fVar301 * auVar308._4_4_;
        fVar206 = -fVar206 * fVar311 * auVar308._8_4_;
        fVar207 = -fVar207 * fVar313 * auVar308._12_4_;
        fVar287 = fVar300 * 0.0 * auVar308._0_4_;
        fVar289 = fVar301 * 0.0 * auVar308._4_4_;
        fVar328 = fVar311 * 0.0 * auVar308._8_4_;
        fVar330 = fVar313 * 0.0 * auVar308._12_4_;
        fVar263 = fVar286 * fVar265 * fVar327;
        fVar264 = fVar291 * fVar267 * fVar329;
        fVar279 = fVar298 * fVar268 * fVar331;
        fVar285 = fVar299 * fVar284 * fVar333;
        fVar249 = fVar239 + fVar263;
        fVar251 = fVar245 + fVar264;
        fVar288 = fVar248 + fVar279;
        fVar290 = fVar250 + fVar285;
        fVar291 = -fVar157 * fVar265 * fVar327;
        fVar298 = -fVar168 * fVar267 * fVar329;
        fVar240 = -fVar173 * fVar268 * fVar331;
        fVar246 = -fVar191 * fVar284 * fVar333;
        fVar113 = fVar314 + fVar291;
        fVar119 = fVar321 + fVar298;
        fVar152 = fVar323 + fVar240;
        fVar154 = fVar194 + fVar246;
        fVar265 = fVar265 * 0.0 * fVar327;
        fVar267 = fVar267 * 0.0 * fVar329;
        fVar278 = fVar268 * 0.0 * fVar331;
        fVar286 = fVar284 * 0.0 * fVar333;
        fVar157 = local_348 - fVar302;
        fVar168 = fStack_344 - fVar312;
        fVar173 = fStack_340 - fVar155;
        fVar191 = fStack_33c - fVar253;
        fVar120 = fVar158 + fVar265;
        fVar153 = fVar169 + fVar267;
        fVar156 = fVar171 + fVar278;
        fVar261 = fVar172 + fVar286;
        fVar313 = fVar208 - fVar192;
        fVar232 = fVar231 - fVar205;
        fVar235 = fVar234 - fVar206;
        fVar237 = fVar236 - fVar207;
        fVar299 = fVar76 - fVar287;
        fVar300 = fVar114 - fVar289;
        fVar301 = fVar116 - fVar328;
        fVar311 = fVar118 - fVar330;
        uVar71 = -(uint)(0.0 < (fVar313 * (fVar120 - fVar299) - fVar299 * (fVar113 - fVar313)) * 0.0
                               + (fVar299 * (fVar249 - fVar157) - (fVar120 - fVar299) * fVar157) *
                                 0.0 + ((fVar113 - fVar313) * fVar157 -
                                       (fVar249 - fVar157) * fVar313));
        uVar68 = -(uint)(0.0 < (fVar232 * (fVar153 - fVar300) - fVar300 * (fVar119 - fVar232)) * 0.0
                               + (fVar300 * (fVar251 - fVar168) - (fVar153 - fVar300) * fVar168) *
                                 0.0 + ((fVar119 - fVar232) * fVar168 -
                                       (fVar251 - fVar168) * fVar232));
        uVar70 = -(uint)(0.0 < (fVar235 * (fVar156 - fVar301) - fVar301 * (fVar152 - fVar235)) * 0.0
                               + (fVar301 * (fVar288 - fVar173) - (fVar156 - fVar301) * fVar173) *
                                 0.0 + ((fVar152 - fVar235) * fVar173 -
                                       (fVar288 - fVar173) * fVar235));
        uVar72 = -(uint)(0.0 < (fVar237 * (fVar261 - fVar311) - fVar311 * (fVar154 - fVar237)) * 0.0
                               + (fVar311 * (fVar290 - fVar191) - (fVar261 - fVar311) * fVar191) *
                                 0.0 + ((fVar154 - fVar237) * fVar191 -
                                       (fVar290 - fVar191) * fVar237));
        fVar302 = (float)((uint)(fVar239 - fVar263) & uVar71 | ~uVar71 & (uint)(local_348 + fVar302)
                         );
        fVar312 = (float)((uint)(fVar245 - fVar264) & uVar68 |
                         ~uVar68 & (uint)(fStack_344 + fVar312));
        fVar248 = (float)((uint)(fVar248 - fVar279) & uVar70 |
                         ~uVar70 & (uint)(fStack_340 + fVar155));
        fVar250 = (float)((uint)(fVar250 - fVar285) & uVar72 |
                         ~uVar72 & (uint)(fStack_33c + fVar253));
        fVar208 = (float)((uint)(fVar314 - fVar291) & uVar71 | ~uVar71 & (uint)(fVar208 + fVar192));
        fVar231 = (float)((uint)(fVar321 - fVar298) & uVar68 | ~uVar68 & (uint)(fVar231 + fVar205));
        fVar234 = (float)((uint)(fVar323 - fVar240) & uVar70 | ~uVar70 & (uint)(fVar234 + fVar206));
        fVar236 = (float)((uint)(fVar194 - fVar246) & uVar72 | ~uVar72 & (uint)(fVar236 + fVar207));
        fVar265 = (float)((uint)(fVar158 - fVar265) & uVar71 | ~uVar71 & (uint)(fVar76 + fVar287));
        fVar268 = (float)((uint)(fVar169 - fVar267) & uVar68 | ~uVar68 & (uint)(fVar114 + fVar289));
        fVar284 = (float)((uint)(fVar171 - fVar278) & uVar70 | ~uVar70 & (uint)(fVar116 + fVar328));
        fVar291 = (float)((uint)(fVar172 - fVar286) & uVar72 | ~uVar72 & (uint)(fVar118 + fVar330));
        fVar192 = (float)((uint)fVar157 & uVar71 | ~uVar71 & (uint)fVar249);
        fVar205 = (float)((uint)fVar168 & uVar68 | ~uVar68 & (uint)fVar251);
        fVar206 = (float)((uint)fVar173 & uVar70 | ~uVar70 & (uint)fVar288);
        fVar207 = (float)((uint)fVar191 & uVar72 | ~uVar72 & (uint)fVar290);
        fVar314 = (float)((uint)fVar313 & uVar71 | ~uVar71 & (uint)fVar113);
        fVar321 = (float)((uint)fVar232 & uVar68 | ~uVar68 & (uint)fVar119);
        fVar323 = (float)((uint)fVar235 & uVar70 | ~uVar70 & (uint)fVar152);
        fVar194 = (float)((uint)fVar237 & uVar72 | ~uVar72 & (uint)fVar154);
        fVar267 = (float)((uint)fVar299 & uVar71 | ~uVar71 & (uint)fVar120);
        fVar278 = (float)((uint)fVar300 & uVar68 | ~uVar68 & (uint)fVar153);
        fVar286 = (float)((uint)fVar301 & uVar70 | ~uVar70 & (uint)fVar156);
        fVar298 = (float)((uint)fVar311 & uVar72 | ~uVar72 & (uint)fVar261);
        fVar239 = (float)((uint)fVar249 & uVar71 | ~uVar71 & (uint)fVar157) - fVar302;
        fVar240 = (float)((uint)fVar251 & uVar68 | ~uVar68 & (uint)fVar168) - fVar312;
        fVar245 = (float)((uint)fVar288 & uVar70 | ~uVar70 & (uint)fVar173) - fVar248;
        fVar246 = (float)((uint)fVar290 & uVar72 | ~uVar72 & (uint)fVar191) - fVar250;
        fVar113 = (float)((uint)fVar113 & uVar71 | ~uVar71 & (uint)fVar313) - fVar208;
        fVar119 = (float)((uint)fVar119 & uVar68 | ~uVar68 & (uint)fVar232) - fVar231;
        fVar152 = (float)((uint)fVar152 & uVar70 | ~uVar70 & (uint)fVar235) - fVar234;
        fVar154 = (float)((uint)fVar154 & uVar72 | ~uVar72 & (uint)fVar237) - fVar236;
        fVar313 = (float)((uint)fVar120 & uVar71 | ~uVar71 & (uint)fVar299) - fVar265;
        fVar232 = (float)((uint)fVar153 & uVar68 | ~uVar68 & (uint)fVar300) - fVar268;
        fVar235 = (float)((uint)fVar156 & uVar70 | ~uVar70 & (uint)fVar301) - fVar284;
        fVar237 = (float)((uint)fVar261 & uVar72 | ~uVar72 & (uint)fVar311) - fVar291;
        fVar76 = fVar302 - fVar192;
        fVar114 = fVar312 - fVar205;
        fVar116 = fVar248 - fVar206;
        fVar118 = fVar250 - fVar207;
        fVar299 = fVar208 - fVar314;
        fVar300 = fVar231 - fVar321;
        fVar301 = fVar234 - fVar323;
        fVar311 = fVar236 - fVar194;
        fVar157 = fVar265 - fVar267;
        fVar168 = fVar268 - fVar278;
        fVar173 = fVar284 - fVar286;
        fVar191 = fVar291 - fVar298;
        fVar249 = (fVar208 * fVar313 - fVar265 * fVar113) * 0.0 +
                  (fVar265 * fVar239 - fVar302 * fVar313) * 0.0 +
                  (fVar302 * fVar113 - fVar208 * fVar239);
        fVar251 = (fVar231 * fVar232 - fVar268 * fVar119) * 0.0 +
                  (fVar268 * fVar240 - fVar312 * fVar232) * 0.0 +
                  (fVar312 * fVar119 - fVar231 * fVar240);
        auVar182._4_4_ = fVar251;
        auVar182._0_4_ = fVar249;
        fVar288 = (fVar234 * fVar235 - fVar284 * fVar152) * 0.0 +
                  (fVar284 * fVar245 - fVar248 * fVar235) * 0.0 +
                  (fVar248 * fVar152 - fVar234 * fVar245);
        fVar290 = (fVar236 * fVar237 - fVar291 * fVar154) * 0.0 +
                  (fVar291 * fVar246 - fVar250 * fVar237) * 0.0 +
                  (fVar250 * fVar154 - fVar236 * fVar246);
        auVar324._0_4_ =
             (fVar314 * fVar157 - fVar267 * fVar299) * 0.0 +
             (fVar267 * fVar76 - fVar192 * fVar157) * 0.0 + (fVar192 * fVar299 - fVar314 * fVar76);
        auVar324._4_4_ =
             (fVar321 * fVar168 - fVar278 * fVar300) * 0.0 +
             (fVar278 * fVar114 - fVar205 * fVar168) * 0.0 + (fVar205 * fVar300 - fVar321 * fVar114)
        ;
        auVar324._8_4_ =
             (fVar323 * fVar173 - fVar286 * fVar301) * 0.0 +
             (fVar286 * fVar116 - fVar206 * fVar173) * 0.0 + (fVar206 * fVar301 - fVar323 * fVar116)
        ;
        auVar324._12_4_ =
             (fVar194 * fVar191 - fVar298 * fVar311) * 0.0 +
             (fVar298 * fVar118 - fVar207 * fVar191) * 0.0 + (fVar207 * fVar311 - fVar194 * fVar118)
        ;
        auVar182._8_4_ = fVar288;
        auVar182._12_4_ = fVar290;
        auVar77 = maxps(auVar182,auVar324);
        bVar47 = auVar77._0_4_ <= 0.0 && bVar47;
        auVar183._0_4_ = -(uint)bVar47;
        bVar48 = auVar77._4_4_ <= 0.0 && bVar48;
        auVar183._4_4_ = -(uint)bVar48;
        bVar49 = auVar77._8_4_ <= 0.0 && bVar49;
        auVar183._8_4_ = -(uint)bVar49;
        bVar50 = auVar77._12_4_ <= 0.0 && bVar50;
        auVar183._12_4_ = -(uint)bVar50;
        iVar52 = movmskps(iVar52,auVar183);
        if (iVar52 == 0) {
LAB_00bc985d:
          auVar184._8_8_ = uStack_3a0;
          auVar184._0_8_ = local_3a8;
        }
        else {
          auVar200._0_4_ = fVar157 * fVar113;
          auVar200._4_4_ = fVar168 * fVar119;
          auVar200._8_4_ = fVar173 * fVar152;
          auVar200._12_4_ = fVar191 * fVar154;
          fVar205 = fVar299 * fVar313 - auVar200._0_4_;
          fVar206 = fVar300 * fVar232 - auVar200._4_4_;
          fVar207 = fVar301 * fVar235 - auVar200._8_4_;
          fVar267 = fVar311 * fVar237 - auVar200._12_4_;
          fVar157 = fVar157 * fVar239 - fVar313 * fVar76;
          fVar168 = fVar168 * fVar240 - fVar232 * fVar114;
          fVar173 = fVar173 * fVar245 - fVar235 * fVar116;
          fVar191 = fVar191 * fVar246 - fVar237 * fVar118;
          fVar113 = fVar76 * fVar113 - fVar299 * fVar239;
          fVar278 = fVar114 * fVar119 - fVar300 * fVar240;
          fVar286 = fVar116 * fVar152 - fVar301 * fVar245;
          fVar298 = fVar118 * fVar154 - fVar311 * fVar246;
          auVar226._0_4_ = fVar205 * 0.0 + fVar157 * 0.0 + fVar113;
          auVar226._4_4_ = fVar206 * 0.0 + fVar168 * 0.0 + fVar278;
          auVar226._8_4_ = fVar207 * 0.0 + fVar173 * 0.0 + fVar286;
          auVar226._12_4_ = fVar267 * 0.0 + fVar191 * 0.0 + fVar298;
          auVar77 = rcpps(auVar200,auVar226);
          fVar119 = auVar77._0_4_;
          fVar152 = auVar77._4_4_;
          fVar154 = auVar77._8_4_;
          fVar192 = auVar77._12_4_;
          fVar119 = (1.0 - auVar226._0_4_ * fVar119) * fVar119 + fVar119;
          fVar152 = (1.0 - auVar226._4_4_ * fVar152) * fVar152 + fVar152;
          fVar154 = (1.0 - auVar226._8_4_ * fVar154) * fVar154 + fVar154;
          fVar192 = (1.0 - auVar226._12_4_ * fVar192) * fVar192 + fVar192;
          fVar157 = (fVar265 * fVar113 + fVar208 * fVar157 + fVar302 * fVar205) * fVar119;
          fVar168 = (fVar268 * fVar278 + fVar231 * fVar168 + fVar312 * fVar206) * fVar152;
          fVar173 = (fVar284 * fVar286 + fVar234 * fVar173 + fVar248 * fVar207) * fVar154;
          fVar191 = (fVar291 * fVar298 + fVar236 * fVar191 + fVar250 * fVar267) * fVar192;
          fVar113 = *(float *)(ray + k * 4 + 0x80);
          bVar47 = (fVar157 <= fVar113 && fVar170 <= fVar157) && bVar47;
          auVar98._0_4_ = -(uint)bVar47;
          bVar48 = (fVar168 <= fVar113 && fVar170 <= fVar168) && bVar48;
          auVar98._4_4_ = -(uint)bVar48;
          bVar49 = (fVar173 <= fVar113 && fVar170 <= fVar173) && bVar49;
          auVar98._8_4_ = -(uint)bVar49;
          bVar50 = (fVar191 <= fVar113 && fVar170 <= fVar191) && bVar50;
          auVar98._12_4_ = -(uint)bVar50;
          iVar52 = movmskps(iVar52,auVar98);
          if (iVar52 == 0) goto LAB_00bc985d;
          auVar99._0_8_ =
               CONCAT44(-(uint)(auVar226._4_4_ != 0.0 && bVar48),
                        -(uint)(auVar226._0_4_ != 0.0 && bVar47));
          auVar99._8_4_ = -(uint)(auVar226._8_4_ != 0.0 && bVar49);
          auVar99._12_4_ = -(uint)(auVar226._12_4_ != 0.0 && bVar50);
          iVar52 = movmskps(iVar52,auVar99);
          auVar184._8_8_ = uStack_3a0;
          auVar184._0_8_ = local_3a8;
          if (iVar52 != 0) {
            fVar249 = fVar249 * fVar119;
            fVar251 = fVar251 * fVar152;
            fVar288 = fVar288 * fVar154;
            fVar290 = fVar290 * fVar192;
            local_3f8 = (float)((uint)(1.0 - fVar249) & uVar71 | ~uVar71 & (uint)fVar249);
            fStack_3f4 = (float)((uint)(1.0 - fVar251) & uVar68 | ~uVar68 & (uint)fVar251);
            fStack_3f0 = (float)((uint)(1.0 - fVar288) & uVar70 | ~uVar70 & (uint)fVar288);
            fStack_3ec = (float)((uint)(1.0 - fVar290) & uVar72 | ~uVar72 & (uint)fVar290);
            local_268 = (float)(~uVar71 & (uint)(auVar324._0_4_ * fVar119) |
                               (uint)(1.0 - auVar324._0_4_ * fVar119) & uVar71);
            fStack_264 = (float)(~uVar68 & (uint)(auVar324._4_4_ * fVar152) |
                                (uint)(1.0 - auVar324._4_4_ * fVar152) & uVar68);
            fStack_260 = (float)(~uVar70 & (uint)(auVar324._8_4_ * fVar154) |
                                (uint)(1.0 - auVar324._8_4_ * fVar154) & uVar70);
            fStack_25c = (float)(~uVar72 & (uint)(auVar324._12_4_ * fVar192) |
                                (uint)(1.0 - auVar324._12_4_ * fVar192) & uVar72);
            auVar184._8_4_ = auVar99._8_4_;
            auVar184._0_8_ = auVar99._0_8_;
            auVar184._12_4_ = auVar99._12_4_;
            local_408 = fVar157;
            fStack_404 = fVar168;
            fStack_400 = fVar173;
            fStack_3fc = fVar191;
          }
        }
        iVar52 = movmskps(iVar52,auVar184);
        local_358 = fVar316;
        fStack_354 = fVar322;
        fStack_350 = fVar193;
        fStack_34c = fVar195;
        if (iVar52 != 0) {
          fVar113 = (fVar327 - auVar308._0_4_) * local_3f8 + auVar308._0_4_;
          fVar119 = (fVar329 - auVar308._4_4_) * fStack_3f4 + auVar308._4_4_;
          fVar152 = (fVar331 - auVar308._8_4_) * fStack_3f0 + auVar308._8_4_;
          fVar154 = (fVar333 - auVar308._12_4_) * fStack_3ec + auVar308._12_4_;
          fVar170 = *(float *)((long)local_3c0->ray_space + k * 4 + -0x10);
          auVar100._0_4_ = -(uint)(fVar170 * (fVar113 + fVar113) < local_408) & auVar184._0_4_;
          auVar100._4_4_ = -(uint)(fVar170 * (fVar119 + fVar119) < fStack_404) & auVar184._4_4_;
          auVar100._8_4_ = -(uint)(fVar170 * (fVar152 + fVar152) < fStack_400) & auVar184._8_4_;
          auVar100._12_4_ = -(uint)(fVar170 * (fVar154 + fVar154) < fStack_3fc) & auVar184._12_4_;
          iVar52 = movmskps((int)local_3c0,auVar100);
          if (iVar52 != 0) {
            local_268 = local_268 + local_268 + -1.0;
            fStack_264 = fStack_264 + fStack_264 + -1.0;
            fStack_260 = fStack_260 + fStack_260 + -1.0;
            fStack_25c = fStack_25c + fStack_25c + -1.0;
            local_1e8 = 0;
            local_1d8 = CONCAT44(fStack_394,local_398);
            uStack_1d0 = CONCAT44(fStack_38c,fStack_390);
            local_1c8 = CONCAT44(fVar247,fVar244);
            uStack_1c0 = CONCAT44(fStack_28c,fVar252);
            local_1b8 = CONCAT44(fVar269,fVar262);
            uStack_1b0 = CONCAT44(fStack_29c,fVar276);
            local_1a8 = CONCAT44(fVar233,fVar230);
            uStack_1a0 = CONCAT44(fStack_27c,fVar238);
            local_218 = local_3f8;
            fStack_214 = fStack_3f4;
            fStack_210 = fStack_3f0;
            fStack_20c = fStack_3ec;
            local_208 = local_268;
            fStack_204 = fStack_264;
            fStack_200 = fStack_260;
            fStack_1fc = fStack_25c;
            local_1f8 = local_408;
            fStack_1f4 = fStack_404;
            fStack_1f0 = fStack_400;
            fStack_1ec = fStack_3fc;
            local_1e4 = iVar19;
            local_198 = auVar100;
            if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar75 = 1.0 / fVar75;
              local_188[0] = fVar75 * (local_3f8 + 0.0);
              local_188[1] = fVar75 * (fStack_3f4 + 1.0);
              local_188[2] = fVar75 * (fStack_3f0 + 2.0);
              local_188[3] = fVar75 * (fStack_3ec + 3.0);
              local_178 = CONCAT44(fStack_264,local_268);
              uStack_170 = CONCAT44(fStack_25c,fStack_260);
              local_168[0] = local_408;
              local_168[1] = fStack_404;
              local_168[2] = fStack_400;
              local_168[3] = fStack_3fc;
              auVar136._0_4_ = auVar100._0_4_ & (uint)local_408;
              auVar136._4_4_ = auVar100._4_4_ & (uint)fStack_404;
              auVar136._8_4_ = auVar100._8_4_ & (uint)fStack_400;
              auVar136._12_4_ = auVar100._12_4_ & (uint)fStack_3fc;
              auVar161._0_8_ = CONCAT44(~auVar100._4_4_,~auVar100._0_4_) & 0x7f8000007f800000;
              auVar161._8_4_ = ~auVar100._8_4_ & 0x7f800000;
              auVar161._12_4_ = ~auVar100._12_4_ & 0x7f800000;
              auVar161 = auVar161 | auVar136;
              auVar185._4_4_ = auVar161._0_4_;
              auVar185._0_4_ = auVar161._4_4_;
              auVar185._8_4_ = auVar161._12_4_;
              auVar185._12_4_ = auVar161._8_4_;
              auVar77 = minps(auVar185,auVar161);
              auVar137._0_8_ = auVar77._8_8_;
              auVar137._8_4_ = auVar77._0_4_;
              auVar137._12_4_ = auVar77._4_4_;
              auVar77 = minps(auVar137,auVar77);
              auVar138._0_8_ =
                   CONCAT44(-(uint)(auVar77._4_4_ == auVar161._4_4_) & auVar100._4_4_,
                            -(uint)(auVar77._0_4_ == auVar161._0_4_) & auVar100._0_4_);
              auVar138._8_4_ = -(uint)(auVar77._8_4_ == auVar161._8_4_) & auVar100._8_4_;
              auVar138._12_4_ = -(uint)(auVar77._12_4_ == auVar161._12_4_) & auVar100._12_4_;
              iVar52 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar138);
              auVar101 = auVar100;
              if (iVar52 != 0) {
                auVar101._8_4_ = auVar138._8_4_;
                auVar101._0_8_ = auVar138._0_8_;
                auVar101._12_4_ = auVar138._12_4_;
              }
              uVar71 = movmskps(iVar52,auVar101);
              lVar63 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
                }
              }
              local_3e8 = auVar100;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar170 = local_188[lVar63];
                uVar58 = *(undefined4 *)((long)&local_178 + lVar63 * 4);
                fVar75 = 1.0 - fVar170;
                fVar119 = fVar170 * fVar75 + fVar170 * fVar75;
                fVar113 = fVar75 * fVar75 * -3.0;
                fVar152 = (fVar75 * fVar75 - fVar119) * 3.0;
                fVar75 = (fVar119 - fVar170 * fVar170) * 3.0;
                fVar119 = fVar170 * fVar170 * 3.0;
                *(float *)(ray + k * 4 + 0x80) = local_168[lVar63];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar113 * local_398 + fVar152 * fVar244 + fVar75 * fVar262 + fVar119 * fVar230;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar113 * fStack_394 + fVar152 * fVar247 + fVar75 * fVar269 + fVar119 * fVar233
                ;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar113 * fStack_390 + fVar152 * fVar252 + fVar75 * fVar276 + fVar119 * fVar238
                ;
                *(float *)(ray + k * 4 + 0xf0) = fVar170;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar58;
                *(uint *)(ray + k * 4 + 0x110) = uVar69;
                *(uint *)(ray + k * 4 + 0x120) = uVar67;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pRVar59 = (RTCIntersectArguments *)context;
              }
              else {
                local_518 = CONCAT44(uVar67,uVar67);
                uStack_510 = CONCAT44(uVar67,uVar67);
                local_4b8 = CONCAT44(uVar69,uVar69);
                uStack_4b0._0_4_ = uVar69;
                uStack_4b0._4_4_ = uVar69;
                local_328 = *(undefined8 *)*local_2c0;
                uStack_320 = *(undefined8 *)(*local_2c0 + 8);
                do {
                  local_e8 = local_188[lVar63];
                  uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = *(undefined4 *)((long)&local_178 + lVar63 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_168[lVar63];
                  fVar170 = 1.0 - local_e8;
                  fVar113 = local_e8 * fVar170 + local_e8 * fVar170;
                  fVar119 = (fVar113 - local_e8 * local_e8) * 3.0;
                  fVar75 = local_e8 * local_e8 * 3.0;
                  fVar113 = (fVar170 * fVar170 - fVar113) * 3.0;
                  local_388.context = context->user;
                  fVar170 = fVar170 * fVar170 * -3.0;
                  local_118._0_4_ =
                       fVar170 * local_398 +
                       fVar113 * fVar244 + fVar119 * fVar262 + fVar75 * fVar230;
                  local_108 = fVar170 * fStack_394 +
                              fVar113 * fVar247 + fVar119 * fVar269 + fVar75 * fVar233;
                  local_f8 = fVar170 * fStack_390 +
                             fVar113 * fVar252 + fVar119 * fVar276 + fVar75 * fVar238;
                  local_118._4_4_ = local_118._0_4_;
                  local_118._8_4_ = local_118._0_4_;
                  fStack_10c = (float)local_118._0_4_;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_4b8;
                  uStack_c0 = uStack_4b0;
                  local_b8 = local_518;
                  uStack_b0 = uStack_510;
                  local_a8 = (local_388.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_388.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_3d8 = local_328;
                  uStack_3d0 = uStack_320;
                  local_388.valid = (int *)&local_3d8;
                  pRVar59 = (RTCIntersectArguments *)pGVar20->userPtr;
                  local_388.hit = (RTCHitN *)local_118;
                  local_388.N = 4;
                  p_Var54 = pGVar20->intersectionFilterN;
                  auVar335._8_8_ = pGVar62;
                  auVar335._0_8_ = p_Var54;
                  local_388.geometryUserPtr = pRVar59;
                  local_388.ray = (RTCRayN *)ray;
                  if (p_Var54 != (RTCFilterFunctionN)0x0) {
                    auVar335 = (*p_Var54)(&local_388);
                  }
                  pGVar62 = auVar335._8_8_;
                  auVar108._0_4_ = -(uint)((int)local_3d8 == 0);
                  auVar108._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                  auVar108._8_4_ = -(uint)((int)uStack_3d0 == 0);
                  auVar108._12_4_ = -(uint)(uStack_3d0._4_4_ == 0);
                  uVar71 = movmskps(auVar335._0_4_,auVar108);
                  pRVar55 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                  if ((uVar71 ^ 0xf) == 0) {
                    auVar108 = auVar108 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar59 = context->args;
                    pRVar56 = (RTCIntersectArguments *)pRVar59->filter;
                    auVar51._8_8_ = pGVar62;
                    auVar51._0_8_ = pRVar56;
                    auVar336._8_8_ = pGVar62;
                    auVar336._0_8_ = pRVar56;
                    if ((pRVar56 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar59->flags & 2) != 0 ||
                        (auVar336 = auVar51, ((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar336 = (*(code *)pRVar56)(&local_388);
                    }
                    pGVar62 = auVar336._8_8_;
                    auVar148._0_4_ = -(uint)((int)local_3d8 == 0);
                    auVar148._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                    auVar148._8_4_ = -(uint)((int)uStack_3d0 == 0);
                    auVar148._12_4_ = -(uint)(uStack_3d0._4_4_ == 0);
                    auVar108 = auVar148 ^ _DAT_01febe20;
                    uVar71 = movmskps(auVar336._0_4_,auVar148);
                    pRVar55 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                    if ((uVar71 ^ 0xf) != 0) {
                      RVar24 = *(RTCFeatureFlags *)((long)local_388.hit + 4);
                      uVar71 = *(uint *)((long)local_388.hit + 8);
                      uVar68 = *(uint *)((long)((long)local_388.hit + 8) + 4);
                      *(uint *)(local_388.ray + 0xc0) =
                           ~auVar148._0_4_ & *(uint *)&(local_388.hit)->field_0x0 |
                           *(uint *)(local_388.ray + 0xc0) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0xc4) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0xc4) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 200) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 200) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0xcc) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0xcc) & auVar148._12_4_;
                      RVar24 = *(RTCFeatureFlags *)((long)((long)local_388.hit + 0x10) + 4);
                      uVar71 = *(uint *)((long)local_388.hit + 0x18);
                      uVar68 = *(uint *)((long)((long)local_388.hit + 0x18) + 4);
                      *(uint *)(local_388.ray + 0xd0) =
                           ~auVar148._0_4_ & *(uint *)((long)local_388.hit + 0x10) |
                           *(uint *)(local_388.ray + 0xd0) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0xd4) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0xd4) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 0xd8) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 0xd8) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0xdc) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0xdc) & auVar148._12_4_;
                      RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x20))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_388.ray + 0xe0) =
                           ~auVar148._0_4_ &
                           ((RTCIntersectArguments *)((long)local_388.hit + 0x20))->flags |
                           *(uint *)(local_388.ray + 0xe0) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0xe4) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0xe4) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 0xe8) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 0xe8) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0xec) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0xec) & auVar148._12_4_;
                      RVar24 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))->
                                        filter + 4);
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))->
                                         intersect;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x20))->intersect + 4);
                      *(uint *)(local_388.ray + 0xf0) =
                           ~auVar148._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))->filter
                           | *(uint *)(local_388.ray + 0xf0) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0xf4) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0xf4) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 0xf8) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 0xf8) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0xfc) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0xfc) & auVar148._12_4_;
                      RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x40))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_388.ray + 0x100) =
                           ~auVar148._0_4_ &
                           ((RTCIntersectArguments *)((long)local_388.hit + 0x40))->flags |
                           *(uint *)(local_388.ray + 0x100) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0x104) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0x104) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 0x108) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 0x108) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0x10c) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0x10c) & auVar148._12_4_;
                      RVar24 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))->
                                        filter + 4);
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))->
                                         intersect;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x40))->intersect + 4);
                      *(uint *)(local_388.ray + 0x110) =
                           *(uint *)(local_388.ray + 0x110) & auVar148._0_4_ |
                           ~auVar148._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))->filter
                      ;
                      *(RTCFeatureFlags *)(local_388.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_388.ray + 0x114) & auVar148._4_4_ |
                           ~auVar148._4_4_ & RVar24;
                      *(uint *)(local_388.ray + 0x118) =
                           *(uint *)(local_388.ray + 0x118) & auVar148._8_4_ |
                           ~auVar148._8_4_ & uVar71;
                      *(uint *)(local_388.ray + 0x11c) =
                           *(uint *)(local_388.ray + 0x11c) & auVar148._12_4_ |
                           ~auVar148._12_4_ & uVar68;
                      RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x60))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_388.ray + 0x120) =
                           *(uint *)(local_388.ray + 0x120) & auVar148._0_4_ |
                           ~auVar148._0_4_ &
                           ((RTCIntersectArguments *)((long)local_388.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_388.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_388.ray + 0x124) & auVar148._4_4_ |
                           ~auVar148._4_4_ & RVar24;
                      *(uint *)(local_388.ray + 0x128) =
                           *(uint *)(local_388.ray + 0x128) & auVar148._8_4_ |
                           ~auVar148._8_4_ & uVar71;
                      *(uint *)(local_388.ray + 300) =
                           *(uint *)(local_388.ray + 300) & auVar148._12_4_ |
                           ~auVar148._12_4_ & uVar68;
                      RVar24 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))->
                                        filter + 4);
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))->
                                         intersect;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x60))->intersect + 4);
                      *(uint *)(local_388.ray + 0x130) =
                           ~auVar148._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))->filter
                           | *(uint *)(local_388.ray + 0x130) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0x134) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0x134) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 0x138) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 0x138) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0x13c) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0x13c) & auVar148._12_4_;
                      RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x80))->feature_mask
                      ;
                      uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x80))->
                                         context;
                      uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_388.hit + 0x80))->context + 4);
                      *(RTCRayQueryFlags *)(local_388.ray + 0x140) =
                           ~auVar148._0_4_ &
                           ((RTCIntersectArguments *)((long)local_388.hit + 0x80))->flags |
                           *(uint *)(local_388.ray + 0x140) & auVar148._0_4_;
                      *(RTCFeatureFlags *)(local_388.ray + 0x144) =
                           ~auVar148._4_4_ & RVar24 |
                           *(RTCFeatureFlags *)(local_388.ray + 0x144) & auVar148._4_4_;
                      *(uint *)(local_388.ray + 0x148) =
                           ~auVar148._8_4_ & uVar71 |
                           *(uint *)(local_388.ray + 0x148) & auVar148._8_4_;
                      *(uint *)(local_388.ray + 0x14c) =
                           ~auVar148._12_4_ & uVar68 |
                           *(uint *)(local_388.ray + 0x14c) & auVar148._12_4_;
                      pRVar55 = (RayHitK<4> *)local_388.ray;
                      pRVar59 = (RTCIntersectArguments *)local_388.hit;
                    }
                  }
                  auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                  auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                  auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                  auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                  iVar52 = movmskps((int)pRVar55,auVar109);
                  if (iVar52 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar58;
                  }
                  *(undefined4 *)(local_3e8 + lVar63 * 4) = 0;
                  fVar170 = *(float *)(ray + k * 4 + 0x80);
                  local_3e8._0_4_ = -(uint)(local_408 <= fVar170) & local_3e8._0_4_;
                  local_3e8._4_4_ = -(uint)(fStack_404 <= fVar170) & local_3e8._4_4_;
                  local_3e8._8_4_ = -(uint)(fStack_400 <= fVar170) & local_3e8._8_4_;
                  local_3e8._12_4_ = -(uint)(fStack_3fc <= fVar170) & local_3e8._12_4_;
                  iVar52 = movmskps(iVar52,local_3e8);
                  if (iVar52 != 0) {
                    auVar149._0_4_ = local_3e8._0_4_ & (uint)local_408;
                    auVar149._4_4_ = local_3e8._4_4_ & (uint)fStack_404;
                    auVar149._8_4_ = local_3e8._8_4_ & (uint)fStack_400;
                    auVar149._12_4_ = local_3e8._12_4_ & (uint)fStack_3fc;
                    auVar167._0_8_ =
                         CONCAT44(~local_3e8._4_4_,~local_3e8._0_4_) & 0x7f8000007f800000;
                    auVar167._8_4_ = ~local_3e8._8_4_ & 0x7f800000;
                    auVar167._12_4_ = ~local_3e8._12_4_ & 0x7f800000;
                    auVar167 = auVar167 | auVar149;
                    auVar190._4_4_ = auVar167._0_4_;
                    auVar190._0_4_ = auVar167._4_4_;
                    auVar190._8_4_ = auVar167._12_4_;
                    auVar190._12_4_ = auVar167._8_4_;
                    auVar77 = minps(auVar190,auVar167);
                    auVar150._0_8_ = auVar77._8_8_;
                    auVar150._8_4_ = auVar77._0_4_;
                    auVar150._12_4_ = auVar77._4_4_;
                    auVar77 = minps(auVar150,auVar77);
                    auVar151._0_8_ =
                         CONCAT44(-(uint)(auVar77._4_4_ == auVar167._4_4_) & local_3e8._4_4_,
                                  -(uint)(auVar77._0_4_ == auVar167._0_4_) & local_3e8._0_4_);
                    auVar151._8_4_ = -(uint)(auVar77._8_4_ == auVar167._8_4_) & local_3e8._8_4_;
                    auVar151._12_4_ = -(uint)(auVar77._12_4_ == auVar167._12_4_) & local_3e8._12_4_;
                    iVar57 = movmskps((int)pRVar59,auVar151);
                    auVar110 = local_3e8;
                    if (iVar57 != 0) {
                      auVar110._8_4_ = auVar151._8_4_;
                      auVar110._0_8_ = auVar151._0_8_;
                      auVar110._12_4_ = auVar151._12_4_;
                    }
                    uVar58 = movmskps(iVar57,auVar110);
                    pRVar59 = (RTCIntersectArguments *)
                              CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar58);
                    lVar63 = 0;
                    if (pRVar59 != (RTCIntersectArguments *)0x0) {
                      for (; ((ulong)pRVar59 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
                      }
                    }
                  }
                } while ((char)iVar52 != '\0');
              }
            }
          }
        }
      }
      uVar58 = SUB84(pRVar59,0);
      if (4 < iVar19) {
        local_58 = iVar19;
        iStack_54 = iVar19;
        iStack_50 = iVar19;
        iStack_4c = iVar19;
        local_278._4_4_ = local_278._0_4_;
        fStack_270 = (float)local_278._0_4_;
        fStack_26c = (float)local_278._0_4_;
        local_68 = 1.0 / (float)local_2b8._0_4_;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        local_78 = uVar67;
        uStack_74 = uVar67;
        uStack_70 = uVar67;
        uStack_6c = uVar67;
        local_88 = uVar69;
        uStack_84 = uVar69;
        uStack_80 = uVar69;
        uStack_7c = uVar69;
        lVar63 = 4;
        do {
          fVar301 = fStack_280;
          fVar300 = fStack_284;
          fVar299 = local_288;
          fVar298 = fStack_290;
          fVar291 = fStack_294;
          fVar286 = local_298;
          fVar284 = fStack_2a0;
          fVar278 = fStack_2a4;
          fVar268 = local_2a8;
          uVar68 = (uint)lVar63;
          pRVar59 = (RTCIntersectArguments *)(bezier_basis0 + lVar22);
          pfVar1 = (float *)((long)&pRVar59->flags + lVar63 * 4);
          fVar170 = *pfVar1;
          fVar75 = pfVar1[1];
          fVar113 = pfVar1[2];
          fVar119 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2227768 + lVar63 * 4);
          fVar152 = *pfVar1;
          fVar154 = pfVar1[1];
          fVar157 = pfVar1[2];
          fVar168 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2227bec + lVar63 * 4);
          local_358 = *pfVar1;
          fStack_354 = pfVar1[1];
          fStack_350 = pfVar1[2];
          fStack_34c = pfVar1[3];
          pauVar7 = (undefined1 (*) [16])(lVar22 + 0x2228070 + lVar63 * 4);
          fVar173 = *(float *)*pauVar7;
          fVar191 = *(float *)(*pauVar7 + 4);
          fVar192 = *(float *)(*pauVar7 + 8);
          auVar26 = *(undefined1 (*) [12])*pauVar7;
          fVar205 = *(float *)(*pauVar7 + 0xc);
          _local_338 = *pauVar7;
          fVar237 = local_128 * fVar170 +
                    fVar277 * fVar152 + fVar260 * local_358 + fVar115 * fVar173;
          fVar239 = fStack_124 * fVar75 +
                    fVar277 * fVar154 + fVar260 * fStack_354 + fVar115 * fVar191;
          fVar240 = fStack_120 * fVar113 +
                    fVar277 * fVar157 + fVar260 * fStack_350 + fVar115 * fVar192;
          fVar245 = fStack_11c * fVar119 +
                    fVar277 * fVar168 + fVar260 * fStack_34c + fVar115 * fVar205;
          fVar246 = local_248 * fVar170 +
                    fVar315 * fVar152 + local_2d8 * local_358 + local_2e8 * fVar173;
          fVar248 = fStack_244 * fVar75 +
                    fVar315 * fVar154 + fStack_2d4 * fStack_354 + fStack_2e4 * fVar191;
          fVar249 = fStack_240 * fVar113 +
                    fVar315 * fVar157 + fStack_2d0 * fStack_350 + fStack_2e0 * fVar192;
          fVar250 = fStack_23c * fVar119 +
                    fVar315 * fVar168 + fStack_2cc * fStack_34c + fStack_2dc * fVar205;
          auVar140._0_4_ =
               local_158 * fVar170 +
               local_148 * fVar152 + local_238 * local_358 + local_138 * fVar173;
          auVar140._4_4_ =
               fStack_154 * fVar75 +
               fStack_144 * fVar154 + fStack_234 * fStack_354 + fStack_134 * fVar191;
          auVar140._8_4_ =
               fStack_150 * fVar113 +
               fStack_140 * fVar157 + fStack_230 * fStack_350 + fStack_130 * fVar192;
          auVar140._12_4_ =
               fStack_14c * fVar119 +
               fStack_13c * fVar168 + fStack_22c * fStack_34c + fStack_12c * fVar205;
          pfVar1 = (float *)(bezier_basis1 + lVar22 + lVar63 * 4);
          fVar173 = *pfVar1;
          fVar191 = pfVar1[1];
          fVar192 = pfVar1[2];
          fVar206 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2229b88 + lVar63 * 4);
          fVar207 = *pfVar1;
          fVar230 = pfVar1[1];
          fVar233 = pfVar1[2];
          fVar238 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222a00c + lVar63 * 4);
          fVar244 = *pfVar1;
          fVar247 = pfVar1[1];
          fVar252 = pfVar1[2];
          fVar262 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222a490 + lVar63 * 4);
          fVar269 = *pfVar1;
          fVar276 = pfVar1[1];
          fVar265 = pfVar1[2];
          fVar267 = pfVar1[3];
          fVar321 = local_128 * fVar173 + fVar277 * fVar207 + fVar260 * fVar244 + fVar115 * fVar269;
          fVar323 = fStack_124 * fVar191 + fVar277 * fVar230 + fVar260 * fVar247 + fVar115 * fVar276
          ;
          fVar194 = fStack_120 * fVar192 + fVar277 * fVar233 + fVar260 * fVar252 + fVar115 * fVar265
          ;
          fVar208 = fStack_11c * fVar206 + fVar277 * fVar238 + fVar260 * fVar262 + fVar115 * fVar267
          ;
          fVar232 = local_248 * fVar173 +
                    fVar315 * fVar207 + local_2d8 * fVar244 + local_2e8 * fVar269;
          fVar234 = fStack_244 * fVar191 +
                    fVar315 * fVar230 + fStack_2d4 * fVar247 + fStack_2e4 * fVar276;
          fVar235 = fStack_240 * fVar192 +
                    fVar315 * fVar233 + fStack_2d0 * fVar252 + fStack_2e0 * fVar265;
          fVar236 = fStack_23c * fVar206 +
                    fVar315 * fVar238 + fStack_2cc * fVar262 + fStack_2dc * fVar267;
          auVar325._0_4_ =
               local_158 * fVar173 + local_148 * fVar207 + local_238 * fVar244 + local_138 * fVar269
          ;
          auVar325._4_4_ =
               fStack_154 * fVar191 +
               fStack_144 * fVar230 + fStack_234 * fVar247 + fStack_134 * fVar276;
          auVar325._8_4_ =
               fStack_150 * fVar192 +
               fStack_140 * fVar233 + fStack_230 * fVar252 + fStack_130 * fVar265;
          auVar325._12_4_ =
               fStack_14c * fVar206 +
               fStack_13c * fVar238 + fStack_22c * fVar262 + fStack_12c * fVar267;
          fVar322 = fVar321 - fVar237;
          fVar193 = fVar323 - fVar239;
          fVar195 = fVar194 - fVar240;
          fVar231 = fVar208 - fVar245;
          local_348 = fVar232 - fVar246;
          fStack_344 = fVar234 - fVar248;
          fStack_340 = fVar235 - fVar249;
          fStack_33c = fVar236 - fVar250;
          local_328 = CONCAT44(fVar248,fVar246);
          uStack_320 = CONCAT44(fVar250,fVar249);
          fVar311 = fVar246 * fVar322 - fVar237 * local_348;
          fVar313 = fVar248 * fVar193 - fVar239 * fStack_344;
          fVar314 = fVar249 * fVar195 - fVar240 * fStack_340;
          fVar316 = fVar250 * fVar231 - fVar245 * fStack_33c;
          auVar77 = maxps(auVar140,auVar325);
          bVar47 = fVar311 * fVar311 <=
                   auVar77._0_4_ * auVar77._0_4_ * (fVar322 * fVar322 + local_348 * local_348) &&
                   (int)uVar68 < local_58;
          auVar259._0_4_ = -(uint)bVar47;
          bVar48 = fVar313 * fVar313 <=
                   auVar77._4_4_ * auVar77._4_4_ * (fVar193 * fVar193 + fStack_344 * fStack_344) &&
                   (int)(uVar68 | 1) < iStack_54;
          auVar259._4_4_ = -(uint)bVar48;
          bVar49 = fVar314 * fVar314 <=
                   auVar77._8_4_ * auVar77._8_4_ * (fVar195 * fVar195 + fStack_340 * fStack_340) &&
                   (int)(uVar68 | 2) < iStack_50;
          auVar259._8_4_ = -(uint)bVar49;
          bVar50 = fVar316 * fVar316 <=
                   auVar77._12_4_ * auVar77._12_4_ * (fVar231 * fVar231 + fStack_33c * fStack_33c)
                   && (int)(uVar68 | 3) < iStack_4c;
          auVar259._12_4_ = -(uint)bVar50;
          uVar71 = movmskps((int)pGVar62,auVar259);
          pGVar62 = (Geometry *)(ulong)uVar71;
          fVar311 = local_3b8;
          fVar313 = fStack_3b4;
          fVar314 = fStack_3b0;
          fVar316 = fStack_3ac;
          if (uVar71 != 0) {
            local_2b8._4_4_ = fVar193;
            local_2b8._0_4_ = fVar322;
            fStack_2b0 = fVar195;
            fStack_2ac = fVar231;
            fVar331 = fVar269 * local_318 + fVar244 * local_308 + fVar207 * local_2f8 +
                      fVar173 * fVar196;
            fVar333 = fVar276 * fStack_314 + fVar247 * fStack_304 + fVar230 * fStack_2f4 +
                      fVar191 * fVar196;
            fVar288 = fVar265 * fStack_310 + fVar252 * fStack_300 + fVar233 * fStack_2f0 +
                      fVar192 * fVar196;
            fVar290 = fVar267 * fStack_30c + fVar262 * fStack_2fc + fVar238 * fStack_2ec +
                      fVar206 * fVar196;
            local_338._0_4_ = auVar26._0_4_;
            local_338._4_4_ = auVar26._4_4_;
            fStack_330 = auVar26._8_4_;
            fVar116 = (float)local_338._0_4_ * local_318 + local_358 * local_308 +
                      fVar152 * local_2f8 + fVar170 * fVar196;
            fVar118 = (float)local_338._4_4_ * fStack_314 + fStack_354 * fStack_304 +
                      fVar154 * fStack_2f4 + fVar75 * fVar196;
            fVar120 = fStack_330 * fStack_310 + fStack_350 * fStack_300 + fVar157 * fStack_2f0 +
                      fVar113 * fVar196;
            fVar153 = fVar205 * fStack_30c + fStack_34c * fStack_2fc + fVar168 * fStack_2ec +
                      fVar119 * fVar196;
            pfVar1 = (float *)(lVar22 + 0x22284f4 + lVar63 * 4);
            fVar170 = *pfVar1;
            fVar75 = pfVar1[1];
            fVar113 = pfVar1[2];
            fVar119 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2228978 + lVar63 * 4);
            fVar152 = *pfVar1;
            fVar154 = pfVar1[1];
            fVar157 = pfVar1[2];
            fVar168 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2228dfc + lVar63 * 4);
            fVar173 = *pfVar1;
            fVar191 = pfVar1[1];
            fVar192 = pfVar1[2];
            fVar205 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2229280 + lVar63 * 4);
            fVar206 = *pfVar1;
            fVar207 = pfVar1[1];
            fVar230 = pfVar1[2];
            fVar233 = pfVar1[3];
            fVar155 = local_128 * fVar170 +
                      fVar277 * fVar152 + fVar260 * fVar173 + fVar115 * fVar206;
            fVar156 = fStack_124 * fVar75 +
                      fVar277 * fVar154 + fVar260 * fVar191 + fVar115 * fVar207;
            fVar158 = fStack_120 * fVar113 +
                      fVar277 * fVar157 + fVar260 * fVar192 + fVar115 * fVar230;
            fVar169 = fStack_11c * fVar119 +
                      fVar277 * fVar168 + fVar260 * fVar205 + fVar115 * fVar233;
            fVar302 = local_248 * fVar170 +
                      fVar315 * fVar152 + local_2d8 * fVar173 + local_2e8 * fVar206;
            fVar312 = fStack_244 * fVar75 +
                      fVar315 * fVar154 + fStack_2d4 * fVar191 + fStack_2e4 * fVar207;
            fVar76 = fStack_240 * fVar113 +
                     fVar315 * fVar157 + fStack_2d0 * fVar192 + fStack_2e0 * fVar230;
            fVar114 = fStack_23c * fVar119 +
                      fVar315 * fVar168 + fStack_2cc * fVar205 + fStack_2dc * fVar233;
            pfVar1 = (float *)(lVar22 + 0x222a914 + lVar63 * 4);
            fVar238 = *pfVar1;
            fVar244 = pfVar1[1];
            fVar247 = pfVar1[2];
            fVar252 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222b21c + lVar63 * 4);
            fVar262 = *pfVar1;
            fVar269 = pfVar1[1];
            fVar276 = pfVar1[2];
            fVar265 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222b6a0 + lVar63 * 4);
            fVar267 = *pfVar1;
            fVar311 = pfVar1[1];
            fVar313 = pfVar1[2];
            fVar314 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222ad98 + lVar63 * 4);
            fVar316 = *pfVar1;
            fVar251 = pfVar1[1];
            fVar327 = pfVar1[2];
            fVar329 = pfVar1[3];
            fVar171 = local_128 * fVar238 +
                      fVar277 * fVar316 + fVar260 * fVar262 + fVar115 * fVar267;
            fVar172 = fStack_124 * fVar244 +
                      fVar277 * fVar251 + fVar260 * fVar269 + fVar115 * fVar311;
            fVar253 = fStack_120 * fVar247 +
                      fVar277 * fVar327 + fVar260 * fVar276 + fVar115 * fVar313;
            fVar261 = fStack_11c * fVar252 +
                      fVar277 * fVar329 + fVar260 * fVar265 + fVar115 * fVar314;
            fVar263 = local_248 * fVar238 +
                      fVar315 * fVar316 + local_2d8 * fVar262 + local_2e8 * fVar267;
            fVar264 = fStack_244 * fVar244 +
                      fVar315 * fVar251 + fStack_2d4 * fVar269 + fStack_2e4 * fVar311;
            fVar279 = fStack_240 * fVar247 +
                      fVar315 * fVar327 + fStack_2d0 * fVar276 + fStack_2e0 * fVar313;
            fVar285 = fStack_23c * fVar252 +
                      fVar315 * fVar329 + fStack_2cc * fVar265 + fStack_2dc * fVar314;
            auVar310._0_8_ = CONCAT44(fVar156,fVar155) & 0x7fffffff7fffffff;
            auVar310._8_4_ = ABS(fVar158);
            auVar310._12_4_ = ABS(fVar169);
            auVar227._0_8_ = CONCAT44(fVar312,fVar302) & 0x7fffffff7fffffff;
            auVar227._8_4_ = ABS(fVar76);
            auVar227._12_4_ = ABS(fVar114);
            auVar77 = maxps(auVar310,auVar227);
            auVar319._0_8_ =
                 CONCAT44(fVar75 * fVar196 +
                          fVar154 * fStack_2f4 + fVar191 * fStack_304 + fVar207 * fStack_314,
                          fVar170 * fVar196 +
                          fVar152 * local_2f8 + fVar173 * local_308 + fVar206 * local_318) &
                 0x7fffffff7fffffff;
            auVar319._8_4_ =
                 ABS(fVar113 * fVar196 +
                     fVar157 * fStack_2f0 + fVar192 * fStack_300 + fVar230 * fStack_310);
            auVar319._12_4_ =
                 ABS(fVar119 * fVar196 +
                     fVar168 * fStack_2ec + fVar205 * fStack_2fc + fVar233 * fStack_30c);
            auVar77 = maxps(auVar77,auVar319);
            uVar71 = -(uint)(local_438 <= auVar77._0_4_);
            uVar70 = -(uint)(local_438 <= auVar77._4_4_);
            uVar72 = -(uint)(local_438 <= auVar77._8_4_);
            uVar73 = -(uint)(local_438 <= auVar77._12_4_);
            auVar228._0_4_ = ~uVar71 & (uint)fVar322;
            auVar228._4_4_ = ~uVar70 & (uint)fVar193;
            auVar228._8_4_ = ~uVar72 & (uint)fVar195;
            auVar228._12_4_ = ~uVar73 & (uint)fVar231;
            auVar297._0_4_ = (uint)fVar155 & uVar71;
            auVar297._4_4_ = (uint)fVar156 & uVar70;
            auVar297._8_4_ = (uint)fVar158 & uVar72;
            auVar297._12_4_ = (uint)fVar169 & uVar73;
            auVar297 = auVar297 | auVar228;
            fVar302 = (float)(~uVar71 & (uint)local_348 | (uint)fVar302 & uVar71);
            fVar312 = (float)(~uVar70 & (uint)fStack_344 | (uint)fVar312 & uVar70);
            fVar76 = (float)(~uVar72 & (uint)fStack_340 | (uint)fVar76 & uVar72);
            fVar114 = (float)(~uVar73 & (uint)fStack_33c | (uint)fVar114 & uVar73);
            auVar320._0_8_ = CONCAT44(fVar172,fVar171) & 0x7fffffff7fffffff;
            auVar320._8_4_ = ABS(fVar253);
            auVar320._12_4_ = ABS(fVar261);
            auVar162._0_8_ = CONCAT44(fVar264,fVar263) & 0x7fffffff7fffffff;
            auVar162._8_4_ = ABS(fVar279);
            auVar162._12_4_ = ABS(fVar285);
            auVar77 = maxps(auVar320,auVar162);
            auVar102._0_8_ =
                 CONCAT44(fVar244 * fVar196 +
                          fVar251 * fStack_2f4 + fVar269 * fStack_304 + fVar311 * fStack_314,
                          fVar238 * fVar196 +
                          fVar316 * local_2f8 + fVar262 * local_308 + fVar267 * local_318) &
                 0x7fffffff7fffffff;
            auVar102._8_4_ =
                 ABS(fVar247 * fVar196 +
                     fVar327 * fStack_2f0 + fVar276 * fStack_300 + fVar313 * fStack_310);
            auVar102._12_4_ =
                 ABS(fVar252 * fVar196 +
                     fVar329 * fStack_2ec + fVar265 * fStack_2fc + fVar314 * fStack_30c);
            auVar77 = maxps(auVar77,auVar102);
            uVar71 = -(uint)(local_438 <= auVar77._0_4_);
            uVar70 = -(uint)(local_438 <= auVar77._4_4_);
            uVar72 = -(uint)(local_438 <= auVar77._8_4_);
            uVar73 = -(uint)(local_438 <= auVar77._12_4_);
            fVar327 = (float)((uint)fVar171 & uVar71 | ~uVar71 & (uint)fVar322);
            fVar329 = (float)((uint)fVar172 & uVar70 | ~uVar70 & (uint)fVar193);
            fVar155 = (float)((uint)fVar253 & uVar72 | ~uVar72 & (uint)fVar195);
            fVar156 = (float)((uint)fVar261 & uVar73 | ~uVar73 & (uint)fVar231);
            fVar262 = (float)(~uVar71 & (uint)local_348 | (uint)fVar263 & uVar71);
            fVar276 = (float)(~uVar70 & (uint)fStack_344 | (uint)fVar264 & uVar70);
            fVar267 = (float)(~uVar72 & (uint)fStack_340 | (uint)fVar279 & uVar72);
            fVar313 = (float)(~uVar73 & (uint)fStack_33c | (uint)fVar285 & uVar73);
            fVar168 = auVar297._0_4_;
            fVar170 = auVar297._4_4_;
            fVar75 = auVar297._8_4_;
            fVar113 = auVar297._12_4_;
            auVar201._0_4_ = fVar302 * fVar302 + fVar168 * fVar168;
            auVar201._4_4_ = fVar312 * fVar312 + fVar170 * fVar170;
            auVar201._8_4_ = fVar76 * fVar76 + fVar75 * fVar75;
            auVar201._12_4_ = fVar114 * fVar114 + fVar113 * fVar113;
            auVar77 = rsqrtps(auVar228,auVar201);
            fVar119 = auVar77._0_4_;
            fVar152 = auVar77._4_4_;
            fVar154 = auVar77._8_4_;
            fVar157 = auVar77._12_4_;
            auVar229._0_4_ = fVar119 * fVar119 * auVar201._0_4_ * 0.5 * fVar119;
            auVar229._4_4_ = fVar152 * fVar152 * auVar201._4_4_ * 0.5 * fVar152;
            auVar229._8_4_ = fVar154 * fVar154 * auVar201._8_4_ * 0.5 * fVar154;
            auVar229._12_4_ = fVar157 * fVar157 * auVar201._12_4_ * 0.5 * fVar157;
            fVar206 = fVar119 * 1.5 - auVar229._0_4_;
            fVar207 = fVar152 * 1.5 - auVar229._4_4_;
            fVar230 = fVar154 * 1.5 - auVar229._8_4_;
            fVar233 = fVar157 * 1.5 - auVar229._12_4_;
            auVar202._0_4_ = fVar262 * fVar262 + fVar327 * fVar327;
            auVar202._4_4_ = fVar276 * fVar276 + fVar329 * fVar329;
            auVar202._8_4_ = fVar267 * fVar267 + fVar155 * fVar155;
            auVar202._12_4_ = fVar313 * fVar313 + fVar156 * fVar156;
            auVar77 = rsqrtps(auVar229,auVar202);
            fVar119 = auVar77._0_4_;
            fVar152 = auVar77._4_4_;
            fVar154 = auVar77._8_4_;
            fVar157 = auVar77._12_4_;
            fVar173 = fVar119 * 1.5 - fVar119 * fVar119 * auVar202._0_4_ * 0.5 * fVar119;
            fVar191 = fVar152 * 1.5 - fVar152 * fVar152 * auVar202._4_4_ * 0.5 * fVar152;
            fVar192 = fVar154 * 1.5 - fVar154 * fVar154 * auVar202._8_4_ * 0.5 * fVar154;
            fVar205 = fVar157 * 1.5 - fVar157 * fVar157 * auVar202._12_4_ * 0.5 * fVar157;
            fVar269 = fVar302 * fVar206 * auVar140._0_4_;
            fVar265 = fVar312 * fVar207 * auVar140._4_4_;
            fVar311 = fVar76 * fVar230 * auVar140._8_4_;
            fVar314 = fVar114 * fVar233 * auVar140._12_4_;
            fVar152 = -fVar168 * fVar206 * auVar140._0_4_;
            fVar154 = -fVar170 * fVar207 * auVar140._4_4_;
            fVar157 = -fVar75 * fVar230 * auVar140._8_4_;
            fVar168 = -fVar113 * fVar233 * auVar140._12_4_;
            fVar238 = fVar206 * 0.0 * auVar140._0_4_;
            fVar244 = fVar207 * 0.0 * auVar140._4_4_;
            fVar247 = fVar230 * 0.0 * auVar140._8_4_;
            fVar252 = fVar233 * 0.0 * auVar140._12_4_;
            local_338._0_4_ = fVar116 + fVar238;
            local_338._4_4_ = fVar118 + fVar244;
            fStack_330 = fVar120 + fVar247;
            fStack_32c = fVar153 + fVar252;
            fVar316 = fVar262 * fVar173 * auVar325._0_4_;
            fVar322 = fVar276 * fVar191 * auVar325._4_4_;
            fVar158 = fVar267 * fVar192 * auVar325._8_4_;
            fVar169 = fVar313 * fVar205 * auVar325._12_4_;
            fVar193 = fVar321 + fVar316;
            fVar195 = fVar323 + fVar322;
            fVar231 = fVar194 + fVar158;
            fVar251 = fVar208 + fVar169;
            fVar170 = -fVar327 * fVar173 * auVar325._0_4_;
            fVar75 = -fVar329 * fVar191 * auVar325._4_4_;
            fVar113 = -fVar155 * fVar192 * auVar325._8_4_;
            fVar119 = -fVar156 * fVar205 * auVar325._12_4_;
            fVar327 = fVar232 + fVar170;
            fVar329 = fVar234 + fVar75;
            fVar302 = fVar235 + fVar113;
            fVar312 = fVar236 + fVar119;
            fVar206 = fVar173 * 0.0 * auVar325._0_4_;
            fVar207 = fVar191 * 0.0 * auVar325._4_4_;
            fVar230 = fVar192 * 0.0 * auVar325._8_4_;
            fVar233 = fVar205 * 0.0 * auVar325._12_4_;
            fVar173 = fVar237 - fVar269;
            fVar191 = fVar239 - fVar265;
            fVar192 = fVar240 - fVar311;
            fVar205 = fVar245 - fVar314;
            fVar76 = fVar331 + fVar206;
            fVar114 = fVar333 + fVar207;
            fVar155 = fVar288 + fVar230;
            fVar156 = fVar290 + fVar233;
            fVar262 = fVar246 - fVar152;
            fVar276 = fVar248 - fVar154;
            fVar267 = fVar249 - fVar157;
            fVar313 = fVar250 - fVar168;
            fVar116 = fVar116 - fVar238;
            fVar118 = fVar118 - fVar244;
            fVar120 = fVar120 - fVar247;
            fVar153 = fVar153 - fVar252;
            uVar71 = -(uint)(0.0 < (fVar262 * (fVar76 - fVar116) - fVar116 * (fVar327 - fVar262)) *
                                   0.0 + (fVar116 * (fVar193 - fVar173) -
                                         (fVar76 - fVar116) * fVar173) * 0.0 +
                                         ((fVar327 - fVar262) * fVar173 -
                                         (fVar193 - fVar173) * fVar262));
            uVar70 = -(uint)(0.0 < (fVar276 * (fVar114 - fVar118) - fVar118 * (fVar329 - fVar276)) *
                                   0.0 + (fVar118 * (fVar195 - fVar191) -
                                         (fVar114 - fVar118) * fVar191) * 0.0 +
                                         ((fVar329 - fVar276) * fVar191 -
                                         (fVar195 - fVar191) * fVar276));
            uVar72 = -(uint)(0.0 < (fVar267 * (fVar155 - fVar120) - fVar120 * (fVar302 - fVar267)) *
                                   0.0 + (fVar120 * (fVar231 - fVar192) -
                                         (fVar155 - fVar120) * fVar192) * 0.0 +
                                         ((fVar302 - fVar267) * fVar192 -
                                         (fVar231 - fVar192) * fVar267));
            uVar73 = -(uint)(0.0 < (fVar313 * (fVar156 - fVar153) - fVar153 * (fVar312 - fVar313)) *
                                   0.0 + (fVar153 * (fVar251 - fVar205) -
                                         (fVar156 - fVar153) * fVar205) * 0.0 +
                                         ((fVar312 - fVar313) * fVar205 -
                                         (fVar251 - fVar205) * fVar313));
            fVar316 = (float)((uint)(fVar321 - fVar316) & uVar71 |
                             ~uVar71 & (uint)(fVar237 + fVar269));
            fVar321 = (float)((uint)(fVar323 - fVar322) & uVar70 |
                             ~uVar70 & (uint)(fVar239 + fVar265));
            fVar322 = (float)((uint)(fVar194 - fVar158) & uVar72 |
                             ~uVar72 & (uint)(fVar240 + fVar311));
            fVar323 = (float)((uint)(fVar208 - fVar169) & uVar73 |
                             ~uVar73 & (uint)(fVar245 + fVar314));
            fVar245 = (float)((uint)(fVar232 - fVar170) & uVar71 |
                             ~uVar71 & (uint)(fVar246 + fVar152));
            fVar246 = (float)((uint)(fVar234 - fVar75) & uVar70 |
                             ~uVar70 & (uint)(fVar248 + fVar154));
            fVar248 = (float)((uint)(fVar235 - fVar113) & uVar72 |
                             ~uVar72 & (uint)(fVar249 + fVar157));
            fVar249 = (float)((uint)(fVar236 - fVar119) & uVar73 |
                             ~uVar73 & (uint)(fVar250 + fVar168));
            fVar152 = (float)((uint)(fVar331 - fVar206) & uVar71 | ~uVar71 & local_338._0_4_);
            fVar154 = (float)((uint)(fVar333 - fVar207) & uVar70 | ~uVar70 & local_338._4_4_);
            fVar157 = (float)((uint)(fVar288 - fVar230) & uVar72 | ~uVar72 & (uint)fStack_330);
            fVar168 = (float)((uint)(fVar290 - fVar233) & uVar73 | ~uVar73 & (uint)fStack_32c);
            fVar238 = (float)((uint)fVar173 & uVar71 | ~uVar71 & (uint)fVar193);
            fVar244 = (float)((uint)fVar191 & uVar70 | ~uVar70 & (uint)fVar195);
            fVar247 = (float)((uint)fVar192 & uVar72 | ~uVar72 & (uint)fVar231);
            fVar252 = (float)((uint)fVar205 & uVar73 | ~uVar73 & (uint)fVar251);
            fVar269 = (float)((uint)fVar262 & uVar71 | ~uVar71 & (uint)fVar327);
            fVar265 = (float)((uint)fVar276 & uVar70 | ~uVar70 & (uint)fVar329);
            fVar311 = (float)((uint)fVar267 & uVar72 | ~uVar72 & (uint)fVar302);
            fVar314 = (float)((uint)fVar313 & uVar73 | ~uVar73 & (uint)fVar312);
            fVar206 = (float)((uint)fVar116 & uVar71 | ~uVar71 & (uint)fVar76);
            fVar207 = (float)((uint)fVar118 & uVar70 | ~uVar70 & (uint)fVar114);
            fVar230 = (float)((uint)fVar120 & uVar72 | ~uVar72 & (uint)fVar155);
            fVar233 = (float)((uint)fVar153 & uVar73 | ~uVar73 & (uint)fVar156);
            fVar193 = (float)((uint)fVar193 & uVar71 | ~uVar71 & (uint)fVar173) - fVar316;
            fVar194 = (float)((uint)fVar195 & uVar70 | ~uVar70 & (uint)fVar191) - fVar321;
            fVar195 = (float)((uint)fVar231 & uVar72 | ~uVar72 & (uint)fVar192) - fVar322;
            fVar208 = (float)((uint)fVar251 & uVar73 | ~uVar73 & (uint)fVar205) - fVar323;
            fVar262 = (float)((uint)fVar327 & uVar71 | ~uVar71 & (uint)fVar262) - fVar245;
            fVar276 = (float)((uint)fVar329 & uVar70 | ~uVar70 & (uint)fVar276) - fVar246;
            fVar267 = (float)((uint)fVar302 & uVar72 | ~uVar72 & (uint)fVar267) - fVar248;
            fVar313 = (float)((uint)fVar312 & uVar73 | ~uVar73 & (uint)fVar313) - fVar249;
            fVar231 = (float)((uint)fVar76 & uVar71 | ~uVar71 & (uint)fVar116) - fVar152;
            fVar232 = (float)((uint)fVar114 & uVar70 | ~uVar70 & (uint)fVar118) - fVar154;
            fVar234 = (float)((uint)fVar155 & uVar72 | ~uVar72 & (uint)fVar120) - fVar157;
            fVar235 = (float)((uint)fVar156 & uVar73 | ~uVar73 & (uint)fVar153) - fVar168;
            fVar250 = fVar316 - fVar238;
            fVar251 = fVar321 - fVar244;
            fVar327 = fVar322 - fVar247;
            fVar329 = fVar323 - fVar252;
            fVar170 = fVar245 - fVar269;
            fVar75 = fVar246 - fVar265;
            fVar113 = fVar248 - fVar311;
            fVar119 = fVar249 - fVar314;
            fVar173 = fVar152 - fVar206;
            fVar191 = fVar154 - fVar207;
            fVar192 = fVar157 - fVar230;
            fVar205 = fVar168 - fVar233;
            fVar236 = (fVar245 * fVar231 - fVar152 * fVar262) * 0.0 +
                      (fVar152 * fVar193 - fVar316 * fVar231) * 0.0 +
                      (fVar316 * fVar262 - fVar245 * fVar193);
            fVar237 = (fVar246 * fVar232 - fVar154 * fVar276) * 0.0 +
                      (fVar154 * fVar194 - fVar321 * fVar232) * 0.0 +
                      (fVar321 * fVar276 - fVar246 * fVar194);
            auVar186._4_4_ = fVar237;
            auVar186._0_4_ = fVar236;
            fVar239 = (fVar248 * fVar234 - fVar157 * fVar267) * 0.0 +
                      (fVar157 * fVar195 - fVar322 * fVar234) * 0.0 +
                      (fVar322 * fVar267 - fVar248 * fVar195);
            fVar240 = (fVar249 * fVar235 - fVar168 * fVar313) * 0.0 +
                      (fVar168 * fVar208 - fVar323 * fVar235) * 0.0 +
                      (fVar323 * fVar313 - fVar249 * fVar208);
            auVar326._0_4_ =
                 (fVar269 * fVar173 - fVar206 * fVar170) * 0.0 +
                 (fVar206 * fVar250 - fVar238 * fVar173) * 0.0 +
                 (fVar238 * fVar170 - fVar269 * fVar250);
            auVar326._4_4_ =
                 (fVar265 * fVar191 - fVar207 * fVar75) * 0.0 +
                 (fVar207 * fVar251 - fVar244 * fVar191) * 0.0 +
                 (fVar244 * fVar75 - fVar265 * fVar251);
            auVar326._8_4_ =
                 (fVar311 * fVar192 - fVar230 * fVar113) * 0.0 +
                 (fVar230 * fVar327 - fVar247 * fVar192) * 0.0 +
                 (fVar247 * fVar113 - fVar311 * fVar327);
            auVar326._12_4_ =
                 (fVar314 * fVar205 - fVar233 * fVar119) * 0.0 +
                 (fVar233 * fVar329 - fVar252 * fVar205) * 0.0 +
                 (fVar252 * fVar119 - fVar314 * fVar329);
            auVar186._8_4_ = fVar239;
            auVar186._12_4_ = fVar240;
            auVar77 = maxps(auVar186,auVar326);
            bVar47 = auVar77._0_4_ <= 0.0 && bVar47;
            auVar187._0_4_ = -(uint)bVar47;
            bVar48 = auVar77._4_4_ <= 0.0 && bVar48;
            auVar187._4_4_ = -(uint)bVar48;
            bVar49 = auVar77._8_4_ <= 0.0 && bVar49;
            auVar187._8_4_ = -(uint)bVar49;
            bVar50 = auVar77._12_4_ <= 0.0 && bVar50;
            auVar187._12_4_ = -(uint)bVar50;
            iVar52 = movmskps((int)(bezier_basis1 + lVar22),auVar187);
            if (iVar52 == 0) {
              auVar164._8_8_ = uStack_3a0;
              auVar164._0_8_ = local_3a8;
              iVar52 = 0;
            }
            else {
              fVar207 = fVar170 * fVar231 - fVar173 * fVar262;
              fVar230 = fVar75 * fVar232 - fVar191 * fVar276;
              fVar233 = fVar113 * fVar234 - fVar192 * fVar267;
              fVar238 = fVar119 * fVar235 - fVar205 * fVar313;
              fVar206 = fVar173 * fVar193 - fVar231 * fVar250;
              fVar191 = fVar191 * fVar194 - fVar232 * fVar251;
              fVar192 = fVar192 * fVar195 - fVar234 * fVar327;
              fVar205 = fVar205 * fVar208 - fVar235 * fVar329;
              fVar170 = fVar250 * fVar262 - fVar170 * fVar193;
              fVar244 = fVar251 * fVar276 - fVar75 * fVar194;
              fVar247 = fVar327 * fVar267 - fVar113 * fVar195;
              fVar252 = fVar329 * fVar313 - fVar119 * fVar208;
              auVar163._0_4_ = fVar206 * 0.0 + fVar170;
              auVar163._4_4_ = fVar191 * 0.0 + fVar244;
              auVar163._8_4_ = fVar192 * 0.0 + fVar247;
              auVar163._12_4_ = fVar205 * 0.0 + fVar252;
              auVar243._0_4_ = fVar207 * 0.0 + auVar163._0_4_;
              auVar243._4_4_ = fVar230 * 0.0 + auVar163._4_4_;
              auVar243._8_4_ = fVar233 * 0.0 + auVar163._8_4_;
              auVar243._12_4_ = fVar238 * 0.0 + auVar163._12_4_;
              auVar77 = rcpps(auVar163,auVar243);
              fVar75 = auVar77._0_4_;
              fVar113 = auVar77._4_4_;
              fVar119 = auVar77._8_4_;
              fVar173 = auVar77._12_4_;
              fVar75 = (1.0 - auVar243._0_4_ * fVar75) * fVar75 + fVar75;
              fVar113 = (1.0 - auVar243._4_4_ * fVar113) * fVar113 + fVar113;
              fVar119 = (1.0 - auVar243._8_4_ * fVar119) * fVar119 + fVar119;
              fVar173 = (1.0 - auVar243._12_4_ * fVar173) * fVar173 + fVar173;
              fVar152 = (fVar152 * fVar170 + fVar245 * fVar206 + fVar316 * fVar207) * fVar75;
              fVar154 = (fVar154 * fVar244 + fVar246 * fVar191 + fVar321 * fVar230) * fVar113;
              fVar157 = (fVar157 * fVar247 + fVar248 * fVar192 + fVar322 * fVar233) * fVar119;
              fVar168 = (fVar168 * fVar252 + fVar249 * fVar205 + fVar323 * fVar238) * fVar173;
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              bVar47 = (fVar152 <= fVar170 && (float)local_278._0_4_ <= fVar152) && bVar47;
              auVar203._0_4_ = -(uint)bVar47;
              bVar48 = (fVar154 <= fVar170 && (float)local_278._4_4_ <= fVar154) && bVar48;
              auVar203._4_4_ = -(uint)bVar48;
              bVar49 = (fVar157 <= fVar170 && fStack_270 <= fVar157) && bVar49;
              auVar203._8_4_ = -(uint)bVar49;
              bVar50 = (fVar168 <= fVar170 && fStack_26c <= fVar168) && bVar50;
              auVar203._12_4_ = -(uint)bVar50;
              iVar52 = movmskps(iVar52,auVar203);
              if (iVar52 == 0) {
                auVar164._8_8_ = uStack_3a0;
                auVar164._0_8_ = local_3a8;
                iVar52 = 0;
              }
              else {
                auVar204._0_8_ =
                     CONCAT44(-(uint)(auVar243._4_4_ != 0.0 && bVar48),
                              -(uint)(auVar243._0_4_ != 0.0 && bVar47));
                auVar204._8_4_ = -(uint)(auVar243._8_4_ != 0.0 && bVar49);
                auVar204._12_4_ = -(uint)(auVar243._12_4_ != 0.0 && bVar50);
                iVar52 = movmskps(iVar52,auVar204);
                auVar164._8_8_ = uStack_3a0;
                auVar164._0_8_ = local_3a8;
                if (iVar52 != 0) {
                  fVar236 = fVar236 * fVar75;
                  fVar237 = fVar237 * fVar113;
                  fVar239 = fVar239 * fVar119;
                  fVar240 = fVar240 * fVar173;
                  local_3b8 = (float)((uint)(1.0 - fVar236) & uVar71 | ~uVar71 & (uint)fVar236);
                  fStack_3b4 = (float)((uint)(1.0 - fVar237) & uVar70 | ~uVar70 & (uint)fVar237);
                  fStack_3b0 = (float)((uint)(1.0 - fVar239) & uVar72 | ~uVar72 & (uint)fVar239);
                  fStack_3ac = (float)((uint)(1.0 - fVar240) & uVar73 | ~uVar73 & (uint)fVar240);
                  local_428 = (float)(~uVar71 & (uint)(auVar326._0_4_ * fVar75) |
                                     (uint)(1.0 - auVar326._0_4_ * fVar75) & uVar71);
                  fStack_424 = (float)(~uVar70 & (uint)(auVar326._4_4_ * fVar113) |
                                      (uint)(1.0 - auVar326._4_4_ * fVar113) & uVar70);
                  fStack_420 = (float)(~uVar72 & (uint)(auVar326._8_4_ * fVar119) |
                                      (uint)(1.0 - auVar326._8_4_ * fVar119) & uVar72);
                  fStack_41c = (float)(~uVar73 & (uint)(auVar326._12_4_ * fVar173) |
                                      (uint)(1.0 - auVar326._12_4_ * fVar173) & uVar73);
                  auVar164._8_4_ = auVar204._8_4_;
                  auVar164._0_8_ = auVar204._0_8_;
                  auVar164._12_4_ = auVar204._12_4_;
                  local_508 = fVar152;
                  fStack_504 = fVar154;
                  fStack_500 = fVar157;
                  fStack_4fc = fVar168;
                }
              }
            }
            iVar52 = movmskps(iVar52,auVar164);
            fVar311 = local_3b8;
            fVar313 = fStack_3b4;
            fVar314 = fStack_3b0;
            fVar316 = fStack_3ac;
            fVar170 = local_348;
            fVar75 = fStack_344;
            fVar113 = fStack_340;
            fVar119 = fStack_33c;
            _local_258 = auVar259;
            if (iVar52 != 0) {
              fVar154 = (auVar325._0_4_ - auVar140._0_4_) * local_3b8 + auVar140._0_4_;
              fVar157 = (auVar325._4_4_ - auVar140._4_4_) * fStack_3b4 + auVar140._4_4_;
              fVar168 = (auVar325._8_4_ - auVar140._8_4_) * fStack_3b0 + auVar140._8_4_;
              fVar173 = (auVar325._12_4_ - auVar140._12_4_) * fStack_3ac + auVar140._12_4_;
              fVar152 = *(float *)((long)local_3c0->ray_space + k * 4 + -0x10);
              auVar103._0_4_ = -(uint)(fVar152 * (fVar154 + fVar154) < local_508) & auVar164._0_4_;
              auVar103._4_4_ = -(uint)(fVar152 * (fVar157 + fVar157) < fStack_504) & auVar164._4_4_;
              auVar103._8_4_ = -(uint)(fVar152 * (fVar168 + fVar168) < fStack_500) & auVar164._8_4_;
              auVar103._12_4_ =
                   -(uint)(fVar152 * (fVar173 + fVar173) < fStack_4fc) & auVar164._12_4_;
              iVar52 = movmskps((int)local_3c0,auVar103);
              if (iVar52 != 0) {
                local_428 = local_428 + local_428 + -1.0;
                fStack_424 = fStack_424 + fStack_424 + -1.0;
                fStack_420 = fStack_420 + fStack_420 + -1.0;
                fStack_41c = fStack_41c + fStack_41c + -1.0;
                local_1d8 = CONCAT44(fStack_394,local_398);
                uStack_1d0 = CONCAT44(fStack_38c,fStack_390);
                local_1c8 = CONCAT44(fStack_294,local_298);
                uStack_1c0 = CONCAT44(fStack_28c,fStack_290);
                local_1b8 = CONCAT44(fStack_2a4,local_2a8);
                uStack_1b0 = CONCAT44(fStack_29c,fStack_2a0);
                local_1a8 = CONCAT44(fStack_284,local_288);
                uStack_1a0 = CONCAT44(fStack_27c,fStack_280);
                pGVar62 = (context->scene->geometries).items[(long)pRVar61].ptr;
                pRVar59 = pRVar61;
                local_218 = local_3b8;
                fStack_214 = fStack_3b4;
                fStack_210 = fStack_3b0;
                fStack_20c = fStack_3ac;
                local_208 = local_428;
                fStack_204 = fStack_424;
                fStack_200 = fStack_420;
                fStack_1fc = fStack_41c;
                local_1f8 = local_508;
                fStack_1f4 = fStack_504;
                fStack_1f0 = fStack_500;
                fStack_1ec = fStack_4fc;
                local_1e8 = uVar68;
                local_1e4 = iVar19;
                local_198 = auVar103;
                if ((pGVar62->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar152 = (float)(int)uVar68;
                  local_188[0] = (fVar152 + local_3b8 + 0.0) * local_68;
                  local_188[1] = (fVar152 + fStack_3b4 + 1.0) * fStack_64;
                  local_188[2] = (fVar152 + fStack_3b0 + 2.0) * fStack_60;
                  local_188[3] = (fVar152 + fStack_3ac + 3.0) * fStack_5c;
                  local_178 = CONCAT44(fStack_424,local_428);
                  uStack_170 = CONCAT44(fStack_41c,fStack_420);
                  local_168[0] = local_508;
                  local_168[1] = fStack_504;
                  local_168[2] = fStack_500;
                  local_168[3] = fStack_4fc;
                  auVar141._0_4_ = auVar103._0_4_ & (uint)local_508;
                  auVar141._4_4_ = auVar103._4_4_ & (uint)fStack_504;
                  auVar141._8_4_ = auVar103._8_4_ & (uint)fStack_500;
                  auVar141._12_4_ = auVar103._12_4_ & (uint)fStack_4fc;
                  auVar165._0_8_ = CONCAT44(~auVar103._4_4_,~auVar103._0_4_) & 0x7f8000007f800000;
                  auVar165._8_4_ = ~auVar103._8_4_ & 0x7f800000;
                  auVar165._12_4_ = ~auVar103._12_4_ & 0x7f800000;
                  auVar165 = auVar165 | auVar141;
                  auVar188._4_4_ = auVar165._0_4_;
                  auVar188._0_4_ = auVar165._4_4_;
                  auVar188._8_4_ = auVar165._12_4_;
                  auVar188._12_4_ = auVar165._8_4_;
                  auVar77 = minps(auVar188,auVar165);
                  auVar142._0_8_ = auVar77._8_8_;
                  auVar142._8_4_ = auVar77._0_4_;
                  auVar142._12_4_ = auVar77._4_4_;
                  auVar77 = minps(auVar142,auVar77);
                  auVar143._0_8_ =
                       CONCAT44(-(uint)(auVar77._4_4_ == auVar165._4_4_) & auVar103._4_4_,
                                -(uint)(auVar77._0_4_ == auVar165._0_4_) & auVar103._0_4_);
                  auVar143._8_4_ = -(uint)(auVar77._8_4_ == auVar165._8_4_) & auVar103._8_4_;
                  auVar143._12_4_ = -(uint)(auVar77._12_4_ == auVar165._12_4_) & auVar103._12_4_;
                  iVar52 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar143);
                  auVar104 = auVar103;
                  if (iVar52 != 0) {
                    auVar104._8_4_ = auVar143._8_4_;
                    auVar104._0_8_ = auVar143._0_8_;
                    auVar104._12_4_ = auVar143._12_4_;
                  }
                  uVar71 = movmskps(iVar52,auVar104);
                  lVar64 = 0;
                  if (uVar71 != 0) {
                    for (; (uVar71 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  local_3e8 = auVar103;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar62->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar152 = local_188[lVar64];
                    uVar58 = *(undefined4 *)((long)&local_178 + lVar64 * 4);
                    fVar154 = 1.0 - fVar152;
                    fVar168 = fVar152 * fVar154 + fVar152 * fVar154;
                    fVar157 = fVar154 * fVar154 * -3.0;
                    fVar173 = (fVar154 * fVar154 - fVar168) * 3.0;
                    fVar154 = (fVar168 - fVar152 * fVar152) * 3.0;
                    fVar168 = fVar152 * fVar152 * 3.0;
                    *(float *)(ray + k * 4 + 0x80) = local_168[lVar64];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar157 * local_398 +
                         fVar173 * local_298 + fVar154 * local_2a8 + fVar168 * local_288;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar157 * fStack_394 +
                         fVar173 * fStack_294 + fVar154 * fStack_2a4 + fVar168 * fStack_284;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar157 * fStack_390 +
                         fVar173 * fStack_290 + fVar154 * fStack_2a0 + fVar168 * fStack_280;
                    *(float *)(ray + k * 4 + 0xf0) = fVar152;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar58;
                    *(uint *)(ray + k * 4 + 0x110) = uVar69;
                    *(uint *)(ray + k * 4 + 0x120) = uVar67;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pRVar59 = (RTCIntersectArguments *)context;
                  }
                  else {
                    auVar77 = *local_2c0;
                    do {
                      local_e8 = local_188[lVar64];
                      uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_d8 = *(undefined4 *)((long)&local_178 + lVar64 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_168[lVar64];
                      fVar170 = 1.0 - local_e8;
                      fVar113 = local_e8 * fVar170 + local_e8 * fVar170;
                      fVar119 = (fVar113 - local_e8 * local_e8) * 3.0;
                      fVar75 = local_e8 * local_e8 * 3.0;
                      fVar113 = (fVar170 * fVar170 - fVar113) * 3.0;
                      local_388.context = context->user;
                      fVar170 = fVar170 * fVar170 * -3.0;
                      local_118._0_4_ =
                           fVar170 * local_398 +
                           fVar113 * fVar286 + fVar119 * fVar268 + fVar75 * fVar299;
                      local_108 = fVar170 * fStack_394 +
                                  fVar113 * fVar291 + fVar119 * fVar278 + fVar75 * fVar300;
                      local_f8 = fVar170 * fStack_390 +
                                 fVar113 * fVar298 + fVar119 * fVar284 + fVar75 * fVar301;
                      local_118._4_4_ = local_118._0_4_;
                      local_118._8_4_ = local_118._0_4_;
                      fStack_10c = (float)local_118._0_4_;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      uStack_d4 = local_d8;
                      uStack_d0 = local_d8;
                      uStack_cc = local_d8;
                      local_c8 = CONCAT44(uStack_84,local_88);
                      uStack_c0 = CONCAT44(uStack_7c,uStack_80);
                      local_b8 = CONCAT44(uStack_74,local_78);
                      uStack_b0 = CONCAT44(uStack_6c,uStack_70);
                      local_a8 = (local_388.context)->instID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_98 = (local_388.context)->instPrimID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_478 = auVar77._0_8_;
                      uStack_470 = auVar77._8_8_;
                      local_3d8 = local_478;
                      uStack_3d0 = uStack_470;
                      local_388.valid = (int *)&local_3d8;
                      pRVar59 = (RTCIntersectArguments *)pGVar62->userPtr;
                      local_388.hit = (RTCHitN *)local_118;
                      local_388.N = 4;
                      p_Var54 = pGVar62->intersectionFilterN;
                      local_388.geometryUserPtr = pRVar59;
                      local_388.ray = (RTCRayN *)ray;
                      if (p_Var54 != (RTCFilterFunctionN)0x0) {
                        p_Var54 = (RTCFilterFunctionN)(*p_Var54)(&local_388);
                        fVar311 = local_3b8;
                        fVar313 = fStack_3b4;
                        fVar314 = fStack_3b0;
                        fVar316 = fStack_3ac;
                      }
                      auVar105._0_4_ = -(uint)((int)local_3d8 == 0);
                      auVar105._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                      auVar105._8_4_ = -(uint)((int)uStack_3d0 == 0);
                      auVar105._12_4_ = -(uint)(uStack_3d0._4_4_ == 0);
                      uVar71 = movmskps((int)p_Var54,auVar105);
                      pRVar55 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                      if ((uVar71 ^ 0xf) == 0) {
                        auVar105 = auVar105 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar59 = context->args;
                        pRVar56 = (RTCIntersectArguments *)pRVar59->filter;
                        if ((pRVar56 != (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar59->flags & 2) != 0 ||
                            (((pGVar62->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar56 = (RTCIntersectArguments *)(*(code *)pRVar56)(&local_388);
                          fVar311 = local_3b8;
                          fVar313 = fStack_3b4;
                          fVar314 = fStack_3b0;
                          fVar316 = fStack_3ac;
                        }
                        auVar144._0_4_ = -(uint)((int)local_3d8 == 0);
                        auVar144._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                        auVar144._8_4_ = -(uint)((int)uStack_3d0 == 0);
                        auVar144._12_4_ = -(uint)(uStack_3d0._4_4_ == 0);
                        auVar105 = auVar144 ^ _DAT_01febe20;
                        uVar71 = movmskps((int)pRVar56,auVar144);
                        pRVar55 = (RayHitK<4> *)(ulong)(uVar71 ^ 0xf);
                        if ((uVar71 ^ 0xf) != 0) {
                          RVar24 = *(RTCFeatureFlags *)((long)local_388.hit + 4);
                          uVar71 = *(uint *)((long)local_388.hit + 8);
                          uVar68 = *(uint *)((long)((long)local_388.hit + 8) + 4);
                          *(uint *)(local_388.ray + 0xc0) =
                               ~auVar144._0_4_ & *(uint *)&(local_388.hit)->field_0x0 |
                               *(uint *)(local_388.ray + 0xc0) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0xc4) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0xc4) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 200) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 200) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0xcc) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0xcc) & auVar144._12_4_;
                          RVar24 = *(RTCFeatureFlags *)((long)((long)local_388.hit + 0x10) + 4);
                          uVar71 = *(uint *)((long)local_388.hit + 0x18);
                          uVar68 = *(uint *)((long)((long)local_388.hit + 0x18) + 4);
                          *(uint *)(local_388.ray + 0xd0) =
                               ~auVar144._0_4_ & *(uint *)((long)local_388.hit + 0x10) |
                               *(uint *)(local_388.ray + 0xd0) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0xd4) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0xd4) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 0xd8) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 0xd8) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0xdc) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0xdc) & auVar144._12_4_;
                          RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x20))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_388.ray + 0xe0) =
                               ~auVar144._0_4_ &
                               ((RTCIntersectArguments *)((long)local_388.hit + 0x20))->flags |
                               *(uint *)(local_388.ray + 0xe0) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0xe4) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0xe4) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 0xe8) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 0xe8) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0xec) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0xec) & auVar144._12_4_;
                          RVar24 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))
                                            ->filter + 4);
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))
                                             ->intersect;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x20))->intersect + 4);
                          *(uint *)(local_388.ray + 0xf0) =
                               ~auVar144._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x20))->
                                         filter | *(uint *)(local_388.ray + 0xf0) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0xf4) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0xf4) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 0xf8) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 0xf8) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0xfc) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0xfc) & auVar144._12_4_;
                          RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x40))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_388.ray + 0x100) =
                               ~auVar144._0_4_ &
                               ((RTCIntersectArguments *)((long)local_388.hit + 0x40))->flags |
                               *(uint *)(local_388.ray + 0x100) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0x104) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0x104) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 0x108) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 0x108) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0x10c) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0x10c) & auVar144._12_4_;
                          RVar24 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))
                                            ->filter + 4);
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))
                                             ->intersect;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x40))->intersect + 4);
                          *(uint *)(local_388.ray + 0x110) =
                               *(uint *)(local_388.ray + 0x110) & auVar144._0_4_ |
                               ~auVar144._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x40))->
                                         filter;
                          *(RTCFeatureFlags *)(local_388.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_388.ray + 0x114) & auVar144._4_4_ |
                               ~auVar144._4_4_ & RVar24;
                          *(uint *)(local_388.ray + 0x118) =
                               *(uint *)(local_388.ray + 0x118) & auVar144._8_4_ |
                               ~auVar144._8_4_ & uVar71;
                          *(uint *)(local_388.ray + 0x11c) =
                               *(uint *)(local_388.ray + 0x11c) & auVar144._12_4_ |
                               ~auVar144._12_4_ & uVar68;
                          RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x60))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_388.ray + 0x120) =
                               *(uint *)(local_388.ray + 0x120) & auVar144._0_4_ |
                               ~auVar144._0_4_ &
                               ((RTCIntersectArguments *)((long)local_388.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_388.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_388.ray + 0x124) & auVar144._4_4_ |
                               ~auVar144._4_4_ & RVar24;
                          *(uint *)(local_388.ray + 0x128) =
                               *(uint *)(local_388.ray + 0x128) & auVar144._8_4_ |
                               ~auVar144._8_4_ & uVar71;
                          *(uint *)(local_388.ray + 300) =
                               *(uint *)(local_388.ray + 300) & auVar144._12_4_ |
                               ~auVar144._12_4_ & uVar68;
                          RVar24 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))
                                            ->filter + 4);
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))
                                             ->intersect;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x60))->intersect + 4);
                          *(uint *)(local_388.ray + 0x130) =
                               ~auVar144._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x60))->
                                         filter | *(uint *)(local_388.ray + 0x130) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0x134) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0x134) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 0x138) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 0x138) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0x13c) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0x13c) & auVar144._12_4_;
                          RVar24 = ((RTCIntersectArguments *)((long)local_388.hit + 0x80))->
                                   feature_mask;
                          uVar71 = *(uint *)&((RTCIntersectArguments *)((long)local_388.hit + 0x80))
                                             ->context;
                          uVar68 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_388.hit + 0x80))->context + 4);
                          *(RTCRayQueryFlags *)(local_388.ray + 0x140) =
                               ~auVar144._0_4_ &
                               ((RTCIntersectArguments *)((long)local_388.hit + 0x80))->flags |
                               *(uint *)(local_388.ray + 0x140) & auVar144._0_4_;
                          *(RTCFeatureFlags *)(local_388.ray + 0x144) =
                               ~auVar144._4_4_ & RVar24 |
                               *(RTCFeatureFlags *)(local_388.ray + 0x144) & auVar144._4_4_;
                          *(uint *)(local_388.ray + 0x148) =
                               ~auVar144._8_4_ & uVar71 |
                               *(uint *)(local_388.ray + 0x148) & auVar144._8_4_;
                          *(uint *)(local_388.ray + 0x14c) =
                               ~auVar144._12_4_ & uVar68 |
                               *(uint *)(local_388.ray + 0x14c) & auVar144._12_4_;
                          pRVar55 = (RayHitK<4> *)local_388.ray;
                          pRVar59 = (RTCIntersectArguments *)local_388.hit;
                        }
                      }
                      auVar106._0_4_ = auVar105._0_4_ << 0x1f;
                      auVar106._4_4_ = auVar105._4_4_ << 0x1f;
                      auVar106._8_4_ = auVar105._8_4_ << 0x1f;
                      auVar106._12_4_ = auVar105._12_4_ << 0x1f;
                      iVar52 = movmskps((int)pRVar55,auVar106);
                      if (iVar52 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar58;
                      }
                      *(undefined4 *)(local_3e8 + lVar64 * 4) = 0;
                      fVar170 = *(float *)(ray + k * 4 + 0x80);
                      local_3e8._0_4_ = -(uint)(local_508 <= fVar170) & local_3e8._0_4_;
                      local_3e8._4_4_ = -(uint)(fStack_504 <= fVar170) & local_3e8._4_4_;
                      local_3e8._8_4_ = -(uint)(fStack_500 <= fVar170) & local_3e8._8_4_;
                      local_3e8._12_4_ = -(uint)(fStack_4fc <= fVar170) & local_3e8._12_4_;
                      iVar52 = movmskps(iVar52,local_3e8);
                      if (iVar52 != 0) {
                        auVar145._0_4_ = local_3e8._0_4_ & (uint)local_508;
                        auVar145._4_4_ = local_3e8._4_4_ & (uint)fStack_504;
                        auVar145._8_4_ = local_3e8._8_4_ & (uint)fStack_500;
                        auVar145._12_4_ = local_3e8._12_4_ & (uint)fStack_4fc;
                        auVar166._0_8_ =
                             CONCAT44(~local_3e8._4_4_,~local_3e8._0_4_) & 0x7f8000007f800000;
                        auVar166._8_4_ = ~local_3e8._8_4_ & 0x7f800000;
                        auVar166._12_4_ = ~local_3e8._12_4_ & 0x7f800000;
                        auVar166 = auVar166 | auVar145;
                        auVar189._4_4_ = auVar166._0_4_;
                        auVar189._0_4_ = auVar166._4_4_;
                        auVar189._8_4_ = auVar166._12_4_;
                        auVar189._12_4_ = auVar166._8_4_;
                        auVar160 = minps(auVar189,auVar166);
                        auVar146._0_8_ = auVar160._8_8_;
                        auVar146._8_4_ = auVar160._0_4_;
                        auVar146._12_4_ = auVar160._4_4_;
                        auVar160 = minps(auVar146,auVar160);
                        auVar147._0_8_ =
                             CONCAT44(-(uint)(auVar160._4_4_ == auVar166._4_4_) & local_3e8._4_4_,
                                      -(uint)(auVar160._0_4_ == auVar166._0_4_) & local_3e8._0_4_);
                        auVar147._8_4_ = -(uint)(auVar160._8_4_ == auVar166._8_4_) & local_3e8._8_4_
                        ;
                        auVar147._12_4_ =
                             -(uint)(auVar160._12_4_ == auVar166._12_4_) & local_3e8._12_4_;
                        iVar57 = movmskps((int)pRVar59,auVar147);
                        auVar107 = local_3e8;
                        if (iVar57 != 0) {
                          auVar107._8_4_ = auVar147._8_4_;
                          auVar107._0_8_ = auVar147._0_8_;
                          auVar107._12_4_ = auVar147._12_4_;
                        }
                        uVar58 = movmskps(iVar57,auVar107);
                        pRVar59 = (RTCIntersectArguments *)
                                  CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar58);
                        lVar64 = 0;
                        if (pRVar59 != (RTCIntersectArguments *)0x0) {
                          for (; ((ulong)pRVar59 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                          }
                        }
                      }
                      fVar170 = local_348;
                      fVar75 = fStack_344;
                      fVar113 = fStack_340;
                      fVar119 = fStack_33c;
                    } while ((char)iVar52 != '\0');
                  }
                }
              }
            }
          }
          fStack_33c = fVar119;
          fStack_340 = fVar113;
          fStack_344 = fVar75;
          local_348 = fVar170;
          uVar58 = SUB84(pRVar59,0);
          lVar63 = lVar63 + 4;
          local_3b8 = fVar311;
          fStack_3b4 = fVar313;
          fStack_3b0 = fVar314;
          fStack_3ac = fVar316;
        } while ((int)lVar63 < iVar19);
      }
      fVar170 = *(float *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = -(uint)(fStack_44 <= fVar170);
      auVar139._0_4_ = -(uint)(local_48 <= fVar170);
      auVar139._8_4_ = -(uint)(fStack_40 <= fVar170);
      auVar139._12_4_ = -(uint)(fStack_3c <= fVar170);
      uVar67 = movmskps(uVar58,auVar139);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }